

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<4,8>::
     occluded_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  Geometry *pGVar5;
  long lVar6;
  __int_type_conflict _Var7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  byte bVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  uint uVar31;
  bool bVar32;
  bool bVar33;
  ulong uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  int iVar99;
  float fVar100;
  undefined4 uVar101;
  float fVar104;
  vint4 bi_2;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  vint4 bi_1;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  vfloat4 b0;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  vint4 ai_2;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  vint4 bi;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  vint4 ai;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  float fVar162;
  float fVar173;
  vint4 ai_1;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar183;
  float fVar189;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  float fVar190;
  float fVar202;
  float fVar203;
  __m128 a;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar204;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar215;
  float fVar216;
  float fVar217;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar218;
  float fVar227;
  float fVar228;
  vfloat4 a0_1;
  float fVar229;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [64];
  vfloat4 a0;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  int iVar244;
  undefined1 in_ZMM29 [64];
  undefined1 auVar245 [64];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_591;
  float local_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  uint auStack_420 [4];
  RTCFilterFunctionNArguments local_410;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [8];
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [16];
  undefined1 local_310 [8];
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  uint uStack_260;
  float afStack_25c [7];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar26;
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  
  PVar3 = prim[1];
  uVar25 = (ulong)(byte)PVar3;
  fVar100 = *(float *)(prim + uVar25 * 0x19 + 0x12);
  auVar38 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar39 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar38 = vsubps_avx(auVar38,*(undefined1 (*) [16])(prim + uVar25 * 0x19 + 6));
  auVar55._0_4_ = fVar100 * auVar38._0_4_;
  auVar55._4_4_ = fVar100 * auVar38._4_4_;
  auVar55._8_4_ = fVar100 * auVar38._8_4_;
  auVar55._12_4_ = fVar100 * auVar38._12_4_;
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 * 4 + 6)));
  auVar47._0_4_ = fVar100 * auVar39._0_4_;
  auVar47._4_4_ = fVar100 * auVar39._4_4_;
  auVar47._8_4_ = fVar100 * auVar39._8_4_;
  auVar47._12_4_ = fVar100 * auVar39._12_4_;
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 * 5 + 6)));
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 * 6 + 6)));
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 * 0xb + 6)));
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar48 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar48 = vcvtdq2ps_avx(auVar48);
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar25 + 6)));
  uVar34 = (ulong)(uint)((int)(uVar25 * 9) * 2);
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar34 + 6)));
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar34 + uVar25 + 6)));
  auVar41 = vcvtdq2ps_avx(auVar41);
  uVar29 = (ulong)(uint)((int)(uVar25 * 5) << 2);
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 + 6)));
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar57._4_4_ = auVar47._0_4_;
  auVar57._0_4_ = auVar47._0_4_;
  auVar57._8_4_ = auVar47._0_4_;
  auVar57._12_4_ = auVar47._0_4_;
  auVar43 = vshufps_avx(auVar47,auVar47,0x55);
  auVar44 = vshufps_avx(auVar47,auVar47,0xaa);
  fVar100 = auVar44._0_4_;
  auVar53._0_4_ = fVar100 * auVar35._0_4_;
  fVar104 = auVar44._4_4_;
  auVar53._4_4_ = fVar104 * auVar35._4_4_;
  fVar206 = auVar44._8_4_;
  auVar53._8_4_ = fVar206 * auVar35._8_4_;
  fVar190 = auVar44._12_4_;
  auVar53._12_4_ = fVar190 * auVar35._12_4_;
  auVar50._0_4_ = auVar36._0_4_ * fVar100;
  auVar50._4_4_ = auVar36._4_4_ * fVar104;
  auVar50._8_4_ = auVar36._8_4_ * fVar206;
  auVar50._12_4_ = auVar36._12_4_ * fVar190;
  auVar102._0_4_ = auVar37._0_4_ * fVar100;
  auVar102._4_4_ = auVar37._4_4_ * fVar104;
  auVar102._8_4_ = auVar37._8_4_ * fVar206;
  auVar102._12_4_ = auVar37._12_4_ * fVar190;
  auVar44 = vfmadd231ps_fma(auVar53,auVar43,auVar39);
  auVar45 = vfmadd231ps_fma(auVar50,auVar43,auVar48);
  auVar43 = vfmadd231ps_fma(auVar102,auVar41,auVar43);
  auVar46 = vfmadd231ps_fma(auVar44,auVar57,auVar38);
  auVar45 = vfmadd231ps_fma(auVar45,auVar57,auVar40);
  auVar47 = vfmadd231ps_fma(auVar43,auVar42,auVar57);
  auVar58._4_4_ = auVar55._0_4_;
  auVar58._0_4_ = auVar55._0_4_;
  auVar58._8_4_ = auVar55._0_4_;
  auVar58._12_4_ = auVar55._0_4_;
  auVar43 = vshufps_avx(auVar55,auVar55,0x55);
  auVar44 = vshufps_avx(auVar55,auVar55,0xaa);
  auVar35 = vmulps_avx512vl(auVar44,auVar35);
  auVar52._0_4_ = auVar44._0_4_ * auVar36._0_4_;
  auVar52._4_4_ = auVar44._4_4_ * auVar36._4_4_;
  auVar52._8_4_ = auVar44._8_4_ * auVar36._8_4_;
  auVar52._12_4_ = auVar44._12_4_ * auVar36._12_4_;
  auVar54._0_4_ = auVar44._0_4_ * auVar37._0_4_;
  auVar54._4_4_ = auVar44._4_4_ * auVar37._4_4_;
  auVar54._8_4_ = auVar44._8_4_ * auVar37._8_4_;
  auVar54._12_4_ = auVar44._12_4_ * auVar37._12_4_;
  auVar36 = vfmadd231ps_avx512vl(auVar35,auVar43,auVar39);
  auVar39 = vfmadd231ps_fma(auVar52,auVar43,auVar48);
  auVar35 = vfmadd231ps_fma(auVar54,auVar43,auVar41);
  auVar37 = vfmadd231ps_avx512vl(auVar36,auVar58,auVar38);
  auVar36 = vfmadd231ps_fma(auVar39,auVar58,auVar40);
  auVar41 = vfmadd231ps_fma(auVar35,auVar58,auVar42);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar242 = ZEXT1664(auVar38);
  auVar39 = vandps_avx512vl(auVar46,auVar38);
  auVar61._8_4_ = 0x219392ef;
  auVar61._0_8_ = 0x219392ef219392ef;
  auVar61._12_4_ = 0x219392ef;
  uVar34 = vcmpps_avx512vl(auVar39,auVar61,1);
  bVar32 = (bool)((byte)uVar34 & 1);
  auVar44._0_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar46._0_4_;
  bVar32 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar44._4_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar46._4_4_;
  bVar32 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar44._8_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar46._8_4_;
  bVar32 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar44._12_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar46._12_4_;
  auVar39 = vandps_avx512vl(auVar45,auVar38);
  uVar34 = vcmpps_avx512vl(auVar39,auVar61,1);
  bVar32 = (bool)((byte)uVar34 & 1);
  auVar46._0_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar45._0_4_;
  bVar32 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar46._4_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar45._4_4_;
  bVar32 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar46._8_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar45._8_4_;
  bVar32 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar46._12_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar45._12_4_;
  auVar38 = vandps_avx512vl(auVar47,auVar38);
  uVar34 = vcmpps_avx512vl(auVar38,auVar61,1);
  bVar32 = (bool)((byte)uVar34 & 1);
  auVar45._0_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar47._0_4_;
  bVar32 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar45._4_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar47._4_4_;
  bVar32 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar45._8_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar47._8_4_;
  bVar32 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar45._12_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar47._12_4_;
  auVar38 = vrcp14ps_avx512vl(auVar44);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar243 = ZEXT1664(auVar39);
  auVar35 = vfnmadd213ps_avx512vl(auVar44,auVar38,auVar39);
  auVar35 = vfmadd132ps_fma(auVar35,auVar38,auVar38);
  auVar38 = vrcp14ps_avx512vl(auVar46);
  auVar40 = vfnmadd213ps_avx512vl(auVar46,auVar38,auVar39);
  auVar48 = vfmadd132ps_fma(auVar40,auVar38,auVar38);
  auVar38 = vrcp14ps_avx512vl(auVar45);
  auVar39 = vfnmadd213ps_avx512vl(auVar45,auVar38,auVar39);
  auVar42 = vfmadd132ps_fma(auVar39,auVar38,auVar38);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar25 * 7 + 6);
  auVar38 = vpmovsxwd_avx(auVar38);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar40 = vsubps_avx512vl(auVar38,auVar37);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar25 * 9 + 6);
  auVar38 = vpmovsxwd_avx(auVar39);
  auVar63._0_4_ = auVar35._0_4_ * auVar40._0_4_;
  auVar63._4_4_ = auVar35._4_4_ * auVar40._4_4_;
  auVar63._8_4_ = auVar35._8_4_ * auVar40._8_4_;
  auVar63._12_4_ = auVar35._12_4_ * auVar40._12_4_;
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar38 = vsubps_avx512vl(auVar38,auVar37);
  auVar62._0_4_ = auVar35._0_4_ * auVar38._0_4_;
  auVar62._4_4_ = auVar35._4_4_ * auVar38._4_4_;
  auVar62._8_4_ = auVar35._8_4_ * auVar38._8_4_;
  auVar62._12_4_ = auVar35._12_4_ * auVar38._12_4_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar39 = vpmovsxwd_avx(auVar35);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar25 * -2 + 6);
  auVar38 = vpmovsxwd_avx(auVar40);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar38 = vsubps_avx(auVar38,auVar36);
  auVar56._0_4_ = auVar48._0_4_ * auVar38._0_4_;
  auVar56._4_4_ = auVar48._4_4_ * auVar38._4_4_;
  auVar56._8_4_ = auVar48._8_4_ * auVar38._8_4_;
  auVar56._12_4_ = auVar48._12_4_ * auVar38._12_4_;
  auVar38 = vcvtdq2ps_avx(auVar39);
  auVar38 = vsubps_avx(auVar38,auVar36);
  auVar51._0_4_ = auVar48._0_4_ * auVar38._0_4_;
  auVar51._4_4_ = auVar48._4_4_ * auVar38._4_4_;
  auVar51._8_4_ = auVar48._8_4_ * auVar38._8_4_;
  auVar51._12_4_ = auVar48._12_4_ * auVar38._12_4_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar29 + uVar25 + 6);
  auVar38 = vpmovsxwd_avx(auVar48);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar38 = vsubps_avx(auVar38,auVar41);
  auVar65._0_4_ = auVar42._0_4_ * auVar38._0_4_;
  auVar65._4_4_ = auVar42._4_4_ * auVar38._4_4_;
  auVar65._8_4_ = auVar42._8_4_ * auVar38._8_4_;
  auVar65._12_4_ = auVar42._12_4_ * auVar38._12_4_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar25 * 0x17 + 6);
  auVar38 = vpmovsxwd_avx(auVar36);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar38 = vsubps_avx(auVar38,auVar41);
  auVar49._0_4_ = auVar42._0_4_ * auVar38._0_4_;
  auVar49._4_4_ = auVar42._4_4_ * auVar38._4_4_;
  auVar49._8_4_ = auVar42._8_4_ * auVar38._8_4_;
  auVar49._12_4_ = auVar42._12_4_ * auVar38._12_4_;
  auVar38 = vpminsd_avx(auVar63,auVar62);
  auVar39 = vpminsd_avx(auVar56,auVar51);
  auVar38 = vmaxps_avx(auVar38,auVar39);
  auVar39 = vpminsd_avx(auVar65,auVar49);
  uVar101 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar42._4_4_ = uVar101;
  auVar42._0_4_ = uVar101;
  auVar42._8_4_ = uVar101;
  auVar42._12_4_ = uVar101;
  auVar39 = vmaxps_avx512vl(auVar39,auVar42);
  auVar38 = vmaxps_avx(auVar38,auVar39);
  auVar41._8_4_ = 0x3f7ffffa;
  auVar41._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar41._12_4_ = 0x3f7ffffa;
  local_380 = vmulps_avx512vl(auVar38,auVar41);
  auVar38 = vpmaxsd_avx(auVar63,auVar62);
  auVar39 = vpmaxsd_avx(auVar56,auVar51);
  auVar38 = vminps_avx(auVar38,auVar39);
  auVar39 = vpmaxsd_avx(auVar65,auVar49);
  uVar101 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar37._4_4_ = uVar101;
  auVar37._0_4_ = uVar101;
  auVar37._8_4_ = uVar101;
  auVar37._12_4_ = uVar101;
  auVar39 = vminps_avx512vl(auVar39,auVar37);
  auVar38 = vminps_avx(auVar38,auVar39);
  auVar43._8_4_ = 0x3f800003;
  auVar43._0_8_ = 0x3f8000033f800003;
  auVar43._12_4_ = 0x3f800003;
  auVar38 = vmulps_avx512vl(auVar38,auVar43);
  auVar39 = vpbroadcastd_avx512vl();
  uVar16 = vcmpps_avx512vl(local_380,auVar38,2);
  uVar34 = vpcmpgtd_avx512vl(auVar39,_DAT_01ff0cf0);
  uVar34 = ((byte)uVar16 & 0xf) & uVar34;
  bVar32 = (char)uVar34 == '\0';
  local_591 = !bVar32;
  if (bVar32) {
    return local_591;
  }
  local_240 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar239 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar240 = ZEXT1664(auVar38);
  auVar38 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
  auVar245 = ZEXT1664(auVar38);
LAB_01b41043:
  lVar30 = 0;
  for (uVar25 = uVar34; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
    lVar30 = lVar30 + 1;
  }
  uVar31 = *(uint *)(prim + 2);
  pGVar5 = (context->scene->geometries).items[uVar31].ptr;
  lVar6 = *(long *)&pGVar5[1].time_range.upper;
  uVar25 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           (ulong)*(uint *)(prim + lVar30 * 4 + 6) *
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar38 = *(undefined1 (*) [16])(lVar6 + (long)pGVar5[1].intersectionFilterN * uVar25);
  lVar30 = uVar25 + 1;
  auVar39 = *(undefined1 (*) [16])(lVar6 + (long)pGVar5[1].intersectionFilterN * lVar30);
  _Var7 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar35 = *(undefined1 (*) [16])(_Var7 + (long)pGVar5[2].userPtr * uVar25);
  auVar40 = *(undefined1 (*) [16])(_Var7 + (long)pGVar5[2].userPtr * lVar30);
  local_200 = vpbroadcastd_avx512vl();
  auVar48 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar48 = vinsertps_avx(auVar48,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar83._16_16_ = local_200._16_16_;
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar42 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar5[2].intersectionFilterN + (long)pGVar5[2].pointQueryFunc * uVar25),
                       auVar38,auVar41);
  auVar37 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar5[2].intersectionFilterN + (long)pGVar5[2].pointQueryFunc * lVar30),
                       auVar39,auVar41);
  auVar43 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar5[3].userPtr + uVar25 * *(long *)&pGVar5[3].fnumTimeSegments),
                       auVar35,auVar41);
  auVar44 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar5[3].userPtr + *(long *)&pGVar5[3].fnumTimeSegments * lVar30),
                       auVar40,auVar41);
  auVar83._0_16_ = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
  auVar36 = vmulps_avx512vl(auVar39,auVar83._0_16_);
  auVar45 = vfmadd231ps_avx512vl(auVar36,auVar37,auVar83._0_16_);
  auVar36 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar42,auVar45);
  auVar174._0_4_ = auVar36._0_4_ + auVar38._0_4_;
  auVar174._4_4_ = auVar36._4_4_ + auVar38._4_4_;
  auVar174._8_4_ = auVar36._8_4_ + auVar38._8_4_;
  auVar174._12_4_ = auVar36._12_4_ + auVar38._12_4_;
  auVar102 = auVar239._0_16_;
  auVar36 = vfmadd231ps_avx512vl(auVar45,auVar42,auVar102);
  auVar45 = vfnmadd231ps_avx512vl(auVar36,auVar38,auVar102);
  auVar36 = vmulps_avx512vl(auVar40,auVar83._0_16_);
  auVar46 = vfmadd231ps_avx512vl(auVar36,auVar44,auVar83._0_16_);
  auVar36 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar43,auVar46);
  auVar230._0_4_ = auVar36._0_4_ + auVar35._0_4_;
  auVar230._4_4_ = auVar36._4_4_ + auVar35._4_4_;
  auVar230._8_4_ = auVar36._8_4_ + auVar35._8_4_;
  auVar230._12_4_ = auVar36._12_4_ + auVar35._12_4_;
  auVar36 = vfmadd231ps_avx512vl(auVar46,auVar43,auVar102);
  auVar46 = vfnmadd231ps_avx512vl(auVar36,auVar35,auVar102);
  auVar36 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar37,auVar39);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar42,auVar83._0_16_);
  auVar47 = vfmadd231ps_avx512vl(auVar36,auVar38,auVar83._0_16_);
  auVar39 = vmulps_avx512vl(auVar39,auVar102);
  auVar39 = vfnmadd231ps_avx512vl(auVar39,auVar102,auVar37);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar83._0_16_,auVar42);
  auVar37 = vfnmadd231ps_avx512vl(auVar39,auVar83._0_16_,auVar38);
  auVar38 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar44,auVar40);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar43,auVar83._0_16_);
  auVar36 = vfmadd231ps_avx512vl(auVar38,auVar35,auVar83._0_16_);
  auVar38 = vmulps_avx512vl(auVar40,auVar102);
  auVar38 = vfnmadd231ps_avx512vl(auVar38,auVar102,auVar44);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar83._0_16_,auVar43);
  auVar42 = vfnmadd231ps_avx512vl(auVar38,auVar83._0_16_,auVar35);
  auVar38 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar39 = vshufps_avx(auVar230,auVar230,0xc9);
  fVar162 = auVar45._0_4_;
  auVar138._0_4_ = fVar162 * auVar39._0_4_;
  fVar173 = auVar45._4_4_;
  auVar138._4_4_ = fVar173 * auVar39._4_4_;
  fVar204 = auVar45._8_4_;
  auVar138._8_4_ = fVar204 * auVar39._8_4_;
  fVar205 = auVar45._12_4_;
  auVar138._12_4_ = fVar205 * auVar39._12_4_;
  auVar39 = vfmsub231ps_fma(auVar138,auVar38,auVar230);
  auVar35 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar39 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar147._0_4_ = fVar162 * auVar39._0_4_;
  auVar147._4_4_ = fVar173 * auVar39._4_4_;
  auVar147._8_4_ = fVar204 * auVar39._8_4_;
  auVar147._12_4_ = fVar205 * auVar39._12_4_;
  auVar38 = vfmsub231ps_fma(auVar147,auVar38,auVar46);
  auVar40 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar38 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar39 = vshufps_avx(auVar36,auVar36,0xc9);
  fVar100 = auVar37._0_4_;
  auVar191._0_4_ = auVar39._0_4_ * fVar100;
  fVar104 = auVar37._4_4_;
  auVar191._4_4_ = auVar39._4_4_ * fVar104;
  fVar206 = auVar37._8_4_;
  auVar191._8_4_ = auVar39._8_4_ * fVar206;
  fVar190 = auVar37._12_4_;
  auVar191._12_4_ = auVar39._12_4_ * fVar190;
  auVar39 = vfmsub231ps_fma(auVar191,auVar38,auVar36);
  auVar36 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar39 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar192._0_4_ = auVar39._0_4_ * fVar100;
  auVar192._4_4_ = auVar39._4_4_ * fVar104;
  auVar192._8_4_ = auVar39._8_4_ * fVar206;
  auVar192._12_4_ = auVar39._12_4_ * fVar190;
  auVar38 = vfmsub231ps_fma(auVar192,auVar38,auVar42);
  auVar42 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar38 = vdpps_avx(auVar35,auVar35,0x7f);
  fVar202 = auVar38._0_4_;
  auVar81._4_28_ = auVar83._4_28_;
  auVar81._0_4_ = fVar202;
  auVar39 = vrsqrt14ss_avx512f(auVar83._0_16_,auVar81._0_16_);
  fVar203 = auVar39._0_4_;
  auVar39 = vmulss_avx512f(auVar38,ZEXT416(0x3f000000));
  fVar183 = fVar203 * 1.5 - auVar39._0_4_ * fVar203 * fVar203 * fVar203;
  fVar218 = fVar183 * auVar35._0_4_;
  fVar227 = fVar183 * auVar35._4_4_;
  fVar228 = fVar183 * auVar35._8_4_;
  fVar229 = fVar183 * auVar35._12_4_;
  auVar39 = vdpps_avx(auVar35,auVar40,0x7f);
  auVar148._0_4_ = fVar202 * auVar40._0_4_;
  auVar148._4_4_ = fVar202 * auVar40._4_4_;
  auVar148._8_4_ = fVar202 * auVar40._8_4_;
  auVar148._12_4_ = fVar202 * auVar40._12_4_;
  fVar202 = auVar39._0_4_;
  auVar139._0_4_ = fVar202 * auVar35._0_4_;
  auVar139._4_4_ = fVar202 * auVar35._4_4_;
  auVar139._8_4_ = fVar202 * auVar35._8_4_;
  auVar139._12_4_ = fVar202 * auVar35._12_4_;
  auVar35 = vsubps_avx(auVar148,auVar139);
  auVar39 = vrcp14ss_avx512f(auVar83._0_16_,auVar81._0_16_);
  auVar38 = vfnmadd213ss_avx512f(auVar38,auVar39,ZEXT416(0x40000000));
  fVar202 = auVar39._0_4_ * auVar38._0_4_;
  auVar38 = vdpps_avx(auVar36,auVar36,0x7f);
  fVar203 = auVar38._0_4_;
  auVar67._16_16_ = auVar83._16_16_;
  auVar67._0_16_ = auVar83._0_16_;
  auVar82._4_28_ = auVar67._4_28_;
  auVar82._0_4_ = fVar203;
  auVar39 = vrsqrt14ss_avx512f(auVar83._0_16_,auVar82._0_16_);
  fVar189 = auVar39._0_4_;
  auVar39 = vmulss_avx512f(auVar38,ZEXT416(0x3f000000));
  fVar189 = fVar189 * 1.5 - auVar39._0_4_ * fVar189 * fVar189 * fVar189;
  fVar207 = fVar189 * auVar36._0_4_;
  fVar215 = fVar189 * auVar36._4_4_;
  fVar216 = fVar189 * auVar36._8_4_;
  fVar217 = fVar189 * auVar36._12_4_;
  auVar39 = vdpps_avx(auVar36,auVar42,0x7f);
  auVar115._0_4_ = fVar203 * auVar42._0_4_;
  auVar115._4_4_ = fVar203 * auVar42._4_4_;
  auVar115._8_4_ = fVar203 * auVar42._8_4_;
  auVar115._12_4_ = fVar203 * auVar42._12_4_;
  fVar203 = auVar39._0_4_;
  auVar66._0_4_ = fVar203 * auVar36._0_4_;
  auVar66._4_4_ = fVar203 * auVar36._4_4_;
  auVar66._8_4_ = fVar203 * auVar36._8_4_;
  auVar66._12_4_ = fVar203 * auVar36._12_4_;
  auVar40 = vsubps_avx(auVar115,auVar66);
  auVar39 = vrcp14ss_avx512f(auVar83._0_16_,auVar82._0_16_);
  auVar38 = vfnmadd213ss_avx512f(auVar38,auVar39,ZEXT416(0x40000000));
  fVar203 = auVar39._0_4_ * auVar38._0_4_;
  auVar38 = vshufps_avx(auVar174,auVar174,0xff);
  auVar140._0_4_ = fVar218 * auVar38._0_4_;
  auVar140._4_4_ = fVar227 * auVar38._4_4_;
  auVar140._8_4_ = fVar228 * auVar38._8_4_;
  auVar140._12_4_ = fVar229 * auVar38._12_4_;
  local_300 = vsubps_avx(auVar174,auVar140);
  auVar39 = vshufps_avx(auVar45,auVar45,0xff);
  auVar116._0_4_ = fVar218 * auVar39._0_4_ + auVar38._0_4_ * fVar183 * auVar35._0_4_ * fVar202;
  auVar116._4_4_ = fVar227 * auVar39._4_4_ + auVar38._4_4_ * fVar183 * auVar35._4_4_ * fVar202;
  auVar116._8_4_ = fVar228 * auVar39._8_4_ + auVar38._8_4_ * fVar183 * auVar35._8_4_ * fVar202;
  auVar116._12_4_ = fVar229 * auVar39._12_4_ + auVar38._12_4_ * fVar183 * auVar35._12_4_ * fVar202;
  auVar35 = vsubps_avx(auVar45,auVar116);
  local_310._0_4_ = auVar174._0_4_ + auVar140._0_4_;
  local_310._4_4_ = auVar174._4_4_ + auVar140._4_4_;
  fStack_308 = auVar174._8_4_ + auVar140._8_4_;
  fStack_304 = auVar174._12_4_ + auVar140._12_4_;
  auVar117._0_4_ = fVar162 + auVar116._0_4_;
  auVar117._4_4_ = fVar173 + auVar116._4_4_;
  auVar117._8_4_ = fVar204 + auVar116._8_4_;
  auVar117._12_4_ = fVar205 + auVar116._12_4_;
  auVar38 = vshufps_avx(auVar47,auVar47,0xff);
  auVar149._0_4_ = fVar207 * auVar38._0_4_;
  auVar149._4_4_ = fVar215 * auVar38._4_4_;
  auVar149._8_4_ = fVar216 * auVar38._8_4_;
  auVar149._12_4_ = fVar217 * auVar38._12_4_;
  local_320 = vsubps_avx(auVar47,auVar149);
  auVar39 = vshufps_avx(auVar37,auVar37,0xff);
  auVar59._0_4_ = fVar207 * auVar39._0_4_ + auVar38._0_4_ * fVar189 * auVar40._0_4_ * fVar203;
  auVar59._4_4_ = fVar215 * auVar39._4_4_ + auVar38._4_4_ * fVar189 * auVar40._4_4_ * fVar203;
  auVar59._8_4_ = fVar216 * auVar39._8_4_ + auVar38._8_4_ * fVar189 * auVar40._8_4_ * fVar203;
  auVar59._12_4_ = fVar217 * auVar39._12_4_ + auVar38._12_4_ * fVar189 * auVar40._12_4_ * fVar203;
  auVar38 = vsubps_avx(auVar37,auVar59);
  _local_330 = vaddps_avx512vl(auVar47,auVar149);
  auVar60._0_4_ = fVar100 + auVar59._0_4_;
  auVar60._4_4_ = fVar104 + auVar59._4_4_;
  auVar60._8_4_ = fVar206 + auVar59._8_4_;
  auVar60._12_4_ = fVar190 + auVar59._12_4_;
  auVar39 = vmulps_avx512vl(auVar35,auVar41);
  local_340 = vaddps_avx512vl(local_300,auVar39);
  auVar38 = vmulps_avx512vl(auVar38,auVar41);
  local_350 = vsubps_avx512vl(local_320,auVar38);
  auVar38 = vmulps_avx512vl(auVar117,auVar41);
  _local_360 = vaddps_avx512vl(_local_310,auVar38);
  auVar38 = vmulps_avx512vl(auVar60,auVar41);
  _local_370 = vsubps_avx512vl(_local_330,auVar38);
  local_280 = vsubps_avx(local_300,auVar48);
  uVar101 = local_280._0_4_;
  auVar105._4_4_ = uVar101;
  auVar105._0_4_ = uVar101;
  auVar105._8_4_ = uVar101;
  auVar105._12_4_ = uVar101;
  auVar38 = vshufps_avx(local_280,local_280,0x55);
  auVar39 = vshufps_avx(local_280,local_280,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar100 = pre->ray_space[k].vz.field_0.m128[0];
  fVar104 = pre->ray_space[k].vz.field_0.m128[1];
  fVar206 = pre->ray_space[k].vz.field_0.m128[2];
  fVar190 = pre->ray_space[k].vz.field_0.m128[3];
  auVar64._0_4_ = fVar100 * auVar39._0_4_;
  auVar64._4_4_ = fVar104 * auVar39._4_4_;
  auVar64._8_4_ = fVar206 * auVar39._8_4_;
  auVar64._12_4_ = fVar190 * auVar39._12_4_;
  auVar38 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar2,auVar38);
  auVar41 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar105);
  local_290 = vsubps_avx512vl(local_340,auVar48);
  uVar101 = local_290._0_4_;
  auVar118._4_4_ = uVar101;
  auVar118._0_4_ = uVar101;
  auVar118._8_4_ = uVar101;
  auVar118._12_4_ = uVar101;
  auVar38 = vshufps_avx(local_290,local_290,0x55);
  auVar39 = vshufps_avx(local_290,local_290,0xaa);
  auVar106._0_4_ = fVar100 * auVar39._0_4_;
  auVar106._4_4_ = fVar104 * auVar39._4_4_;
  auVar106._8_4_ = fVar206 * auVar39._8_4_;
  auVar106._12_4_ = fVar190 * auVar39._12_4_;
  auVar38 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar2,auVar38);
  auVar37 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar118);
  local_2a0 = vsubps_avx512vl(local_350,auVar48);
  uVar101 = local_2a0._0_4_;
  auVar119._4_4_ = uVar101;
  auVar119._0_4_ = uVar101;
  auVar119._8_4_ = uVar101;
  auVar119._12_4_ = uVar101;
  auVar38 = vshufps_avx(local_2a0,local_2a0,0x55);
  auVar39 = vshufps_avx(local_2a0,local_2a0,0xaa);
  auVar175._0_4_ = auVar39._0_4_ * fVar100;
  auVar175._4_4_ = auVar39._4_4_ * fVar104;
  auVar175._8_4_ = auVar39._8_4_ * fVar206;
  auVar175._12_4_ = auVar39._12_4_ * fVar190;
  auVar38 = vfmadd231ps_fma(auVar175,(undefined1  [16])aVar2,auVar38);
  auVar43 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar119);
  local_2b0 = vsubps_avx(local_320,auVar48);
  uVar101 = local_2b0._0_4_;
  auVar120._4_4_ = uVar101;
  auVar120._0_4_ = uVar101;
  auVar120._8_4_ = uVar101;
  auVar120._12_4_ = uVar101;
  auVar38 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar39 = vshufps_avx(local_2b0,local_2b0,0xaa);
  auVar184._0_4_ = auVar39._0_4_ * fVar100;
  auVar184._4_4_ = auVar39._4_4_ * fVar104;
  auVar184._8_4_ = auVar39._8_4_ * fVar206;
  auVar184._12_4_ = auVar39._12_4_ * fVar190;
  auVar38 = vfmadd231ps_fma(auVar184,(undefined1  [16])aVar2,auVar38);
  auVar44 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar120);
  local_2c0 = vsubps_avx(_local_310,auVar48);
  uVar101 = local_2c0._0_4_;
  auVar121._4_4_ = uVar101;
  auVar121._0_4_ = uVar101;
  auVar121._8_4_ = uVar101;
  auVar121._12_4_ = uVar101;
  auVar38 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar39 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar193._0_4_ = auVar39._0_4_ * fVar100;
  auVar193._4_4_ = auVar39._4_4_ * fVar104;
  auVar193._8_4_ = auVar39._8_4_ * fVar206;
  auVar193._12_4_ = auVar39._12_4_ * fVar190;
  auVar38 = vfmadd231ps_fma(auVar193,(undefined1  [16])aVar2,auVar38);
  auVar45 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar121);
  local_2d0 = vsubps_avx512vl(_local_360,auVar48);
  uVar101 = local_2d0._0_4_;
  auVar122._4_4_ = uVar101;
  auVar122._0_4_ = uVar101;
  auVar122._8_4_ = uVar101;
  auVar122._12_4_ = uVar101;
  auVar38 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar39 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar208._0_4_ = auVar39._0_4_ * fVar100;
  auVar208._4_4_ = auVar39._4_4_ * fVar104;
  auVar208._8_4_ = auVar39._8_4_ * fVar206;
  auVar208._12_4_ = auVar39._12_4_ * fVar190;
  auVar38 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar2,auVar38);
  auVar46 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar122);
  local_2e0 = vsubps_avx512vl(_local_370,auVar48);
  uVar101 = local_2e0._0_4_;
  auVar123._4_4_ = uVar101;
  auVar123._0_4_ = uVar101;
  auVar123._8_4_ = uVar101;
  auVar123._12_4_ = uVar101;
  auVar38 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar39 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar219._0_4_ = auVar39._0_4_ * fVar100;
  auVar219._4_4_ = auVar39._4_4_ * fVar104;
  auVar219._8_4_ = auVar39._8_4_ * fVar206;
  auVar219._12_4_ = auVar39._12_4_ * fVar190;
  auVar38 = vfmadd231ps_fma(auVar219,(undefined1  [16])aVar2,auVar38);
  auVar47 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar123);
  local_2f0 = vsubps_avx512vl(_local_330,auVar48);
  uVar101 = local_2f0._0_4_;
  auVar124._4_4_ = uVar101;
  auVar124._0_4_ = uVar101;
  auVar124._8_4_ = uVar101;
  auVar124._12_4_ = uVar101;
  auVar38 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar39 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar150._0_4_ = fVar100 * auVar39._0_4_;
  auVar150._4_4_ = fVar104 * auVar39._4_4_;
  auVar150._8_4_ = fVar206 * auVar39._8_4_;
  auVar150._12_4_ = fVar190 * auVar39._12_4_;
  auVar38 = vfmadd231ps_fma(auVar150,(undefined1  [16])aVar2,auVar38);
  auVar102 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar124);
  auVar35 = vmovlhps_avx(auVar41,auVar45);
  auVar40 = vmovlhps_avx(auVar37,auVar46);
  auVar36 = vmovlhps_avx512f(auVar43,auVar47);
  auVar42 = vmovlhps_avx512f(auVar44,auVar102);
  auVar39 = vminps_avx(auVar35,auVar40);
  auVar38 = vmaxps_avx(auVar35,auVar40);
  auVar48 = vminps_avx512vl(auVar36,auVar42);
  auVar39 = vminps_avx(auVar39,auVar48);
  auVar48 = vmaxps_avx512vl(auVar36,auVar42);
  auVar38 = vmaxps_avx(auVar38,auVar48);
  auVar48 = vshufpd_avx(auVar39,auVar39,3);
  auVar39 = vminps_avx(auVar39,auVar48);
  auVar48 = vshufpd_avx(auVar38,auVar38,3);
  auVar38 = vmaxps_avx(auVar38,auVar48);
  auVar39 = vandps_avx512vl(auVar39,auVar242._0_16_);
  auVar38 = vandps_avx512vl(auVar38,auVar242._0_16_);
  auVar38 = vmaxps_avx(auVar39,auVar38);
  auVar39 = vmovshdup_avx(auVar38);
  auVar38 = vmaxss_avx(auVar39,auVar38);
  fVar104 = auVar38._0_4_ * 9.536743e-07;
  auVar48 = vmovddup_avx512vl(auVar41);
  auVar41 = vmovddup_avx512vl(auVar37);
  auVar107._8_8_ = auVar43._0_8_;
  auVar107._0_8_ = auVar43._0_8_;
  auVar176._8_8_ = auVar44._0_8_;
  auVar176._0_8_ = auVar44._0_8_;
  local_1c0 = vbroadcastss_avx512vl(ZEXT416((uint)fVar104));
  auVar38 = vxorps_avx512vl(local_1c0._0_16_,auVar240._0_16_);
  local_1e0 = vbroadcastss_avx512vl(auVar38);
  bVar32 = false;
  uVar25 = 0;
  fVar100 = *(float *)(ray + k * 4 + 0x60);
  auVar38 = vsubps_avx(auVar40,auVar35);
  auVar37 = vsubps_avx512vl(auVar36,auVar40);
  local_270 = vsubps_avx512vl(auVar42,auVar36);
  local_390 = vsubps_avx(_local_310,local_300);
  local_3a0 = vsubps_avx512vl(_local_360,local_340);
  local_3b0 = vsubps_avx512vl(_local_370,local_350);
  _local_3c0 = vsubps_avx512vl(_local_330,local_320);
  local_220 = vpbroadcastd_avx512vl();
  auVar39 = ZEXT816(0x3f80000000000000);
  auVar226 = ZEXT1664(auVar39);
  do {
    auVar52 = auVar226._0_16_;
    auVar43 = vshufps_avx(auVar52,auVar52,0x50);
    auVar231._8_4_ = 0x3f800000;
    auVar231._0_8_ = &DAT_3f8000003f800000;
    auVar231._12_4_ = 0x3f800000;
    auVar135._16_4_ = 0x3f800000;
    auVar135._0_16_ = auVar231;
    auVar135._20_4_ = 0x3f800000;
    auVar135._24_4_ = 0x3f800000;
    auVar135._28_4_ = 0x3f800000;
    auVar44 = vsubps_avx(auVar231,auVar43);
    fVar206 = auVar43._0_4_;
    fVar183 = auVar45._0_4_;
    auVar129._0_4_ = fVar183 * fVar206;
    fVar190 = auVar43._4_4_;
    fVar189 = auVar45._4_4_;
    auVar129._4_4_ = fVar189 * fVar190;
    fVar202 = auVar43._8_4_;
    auVar129._8_4_ = fVar183 * fVar202;
    fVar203 = auVar43._12_4_;
    auVar129._12_4_ = fVar189 * fVar203;
    fVar162 = auVar46._0_4_;
    auVar141._0_4_ = fVar162 * fVar206;
    fVar173 = auVar46._4_4_;
    auVar141._4_4_ = fVar173 * fVar190;
    auVar141._8_4_ = fVar162 * fVar202;
    auVar141._12_4_ = fVar173 * fVar203;
    fVar215 = auVar47._0_4_;
    auVar151._0_4_ = fVar215 * fVar206;
    fVar216 = auVar47._4_4_;
    auVar151._4_4_ = fVar216 * fVar190;
    auVar151._8_4_ = fVar215 * fVar202;
    auVar151._12_4_ = fVar216 * fVar203;
    fVar217 = auVar102._0_4_;
    auVar108._0_4_ = fVar217 * fVar206;
    fVar218 = auVar102._4_4_;
    auVar108._4_4_ = fVar218 * fVar190;
    auVar108._8_4_ = fVar217 * fVar202;
    auVar108._12_4_ = fVar218 * fVar203;
    auVar49 = vfmadd231ps_avx512vl(auVar129,auVar44,auVar48);
    auVar50 = vfmadd231ps_avx512vl(auVar141,auVar44,auVar41);
    auVar51 = vfmadd231ps_avx512vl(auVar151,auVar44,auVar107);
    auVar44 = vfmadd231ps_fma(auVar108,auVar176,auVar44);
    auVar43 = vmovshdup_avx(auVar39);
    fVar190 = auVar39._0_4_;
    fVar206 = (auVar43._0_4_ - fVar190) * 0.04761905;
    auVar80._4_4_ = fVar190;
    auVar80._0_4_ = fVar190;
    auVar80._8_4_ = fVar190;
    auVar80._12_4_ = fVar190;
    auVar80._16_4_ = fVar190;
    auVar80._20_4_ = fVar190;
    auVar80._24_4_ = fVar190;
    auVar80._28_4_ = fVar190;
    auVar74._0_8_ = auVar43._0_8_;
    auVar74._8_8_ = auVar74._0_8_;
    auVar74._16_8_ = auVar74._0_8_;
    auVar74._24_8_ = auVar74._0_8_;
    auVar83 = vsubps_avx(auVar74,auVar80);
    uVar101 = auVar49._0_4_;
    auVar86._4_4_ = uVar101;
    auVar86._0_4_ = uVar101;
    auVar86._8_4_ = uVar101;
    auVar86._12_4_ = uVar101;
    auVar86._16_4_ = uVar101;
    auVar86._20_4_ = uVar101;
    auVar86._24_4_ = uVar101;
    auVar86._28_4_ = uVar101;
    auVar75._8_4_ = 1;
    auVar75._0_8_ = 0x100000001;
    auVar75._12_4_ = 1;
    auVar75._16_4_ = 1;
    auVar75._20_4_ = 1;
    auVar75._24_4_ = 1;
    auVar75._28_4_ = 1;
    auVar82 = ZEXT1632(auVar49);
    auVar81 = vpermps_avx2(auVar75,auVar82);
    auVar67 = vbroadcastss_avx512vl(auVar50);
    auVar84 = ZEXT1632(auVar50);
    auVar68 = vpermps_avx512vl(auVar75,auVar84);
    auVar69 = vbroadcastss_avx512vl(auVar51);
    auVar77 = ZEXT1632(auVar51);
    auVar70 = vpermps_avx512vl(auVar75,auVar77);
    auVar71 = vbroadcastss_avx512vl(auVar44);
    auVar79 = ZEXT1632(auVar44);
    auVar72 = vpermps_avx512vl(auVar75,auVar79);
    auVar87._4_4_ = fVar206;
    auVar87._0_4_ = fVar206;
    auVar87._8_4_ = fVar206;
    auVar87._12_4_ = fVar206;
    auVar87._16_4_ = fVar206;
    auVar87._20_4_ = fVar206;
    auVar87._24_4_ = fVar206;
    auVar87._28_4_ = fVar206;
    auVar78._8_4_ = 2;
    auVar78._0_8_ = 0x200000002;
    auVar78._12_4_ = 2;
    auVar78._16_4_ = 2;
    auVar78._20_4_ = 2;
    auVar78._24_4_ = 2;
    auVar78._28_4_ = 2;
    auVar73 = vpermps_avx512vl(auVar78,auVar82);
    auVar74 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar75 = vpermps_avx512vl(auVar74,auVar82);
    auVar82 = vpermps_avx2(auVar78,auVar84);
    auVar76 = vpermps_avx512vl(auVar74,auVar84);
    auVar84 = vpermps_avx2(auVar78,auVar77);
    auVar77 = vpermps_avx512vl(auVar74,auVar77);
    auVar78 = vpermps_avx512vl(auVar78,auVar79);
    auVar74 = vpermps_avx512vl(auVar74,auVar79);
    auVar43 = vfmadd132ps_fma(auVar83,auVar80,_DAT_02020f20);
    auVar83 = vsubps_avx(auVar135,ZEXT1632(auVar43));
    auVar79 = vmulps_avx512vl(auVar67,ZEXT1632(auVar43));
    auVar85 = ZEXT1632(auVar43);
    auVar80 = vmulps_avx512vl(auVar68,auVar85);
    auVar44 = vfmadd231ps_fma(auVar79,auVar83,auVar86);
    auVar49 = vfmadd231ps_fma(auVar80,auVar83,auVar81);
    auVar79 = vmulps_avx512vl(auVar69,auVar85);
    auVar80 = vmulps_avx512vl(auVar70,auVar85);
    auVar67 = vfmadd231ps_avx512vl(auVar79,auVar83,auVar67);
    auVar79 = vfmadd231ps_avx512vl(auVar80,auVar83,auVar68);
    auVar68 = vmulps_avx512vl(auVar71,auVar85);
    auVar86 = ZEXT1632(auVar43);
    auVar72 = vmulps_avx512vl(auVar72,auVar86);
    auVar80 = vfmadd231ps_avx512vl(auVar68,auVar83,auVar69);
    auVar72 = vfmadd231ps_avx512vl(auVar72,auVar83,auVar70);
    fVar202 = auVar43._0_4_;
    fVar203 = auVar43._4_4_;
    auVar68._4_4_ = fVar203 * auVar67._4_4_;
    auVar68._0_4_ = fVar202 * auVar67._0_4_;
    fVar204 = auVar43._8_4_;
    auVar68._8_4_ = fVar204 * auVar67._8_4_;
    fVar205 = auVar43._12_4_;
    auVar68._12_4_ = fVar205 * auVar67._12_4_;
    auVar68._16_4_ = auVar67._16_4_ * 0.0;
    auVar68._20_4_ = auVar67._20_4_ * 0.0;
    auVar68._24_4_ = auVar67._24_4_ * 0.0;
    auVar68._28_4_ = fVar190;
    auVar69._4_4_ = fVar203 * auVar79._4_4_;
    auVar69._0_4_ = fVar202 * auVar79._0_4_;
    auVar69._8_4_ = fVar204 * auVar79._8_4_;
    auVar69._12_4_ = fVar205 * auVar79._12_4_;
    auVar69._16_4_ = auVar79._16_4_ * 0.0;
    auVar69._20_4_ = auVar79._20_4_ * 0.0;
    auVar69._24_4_ = auVar79._24_4_ * 0.0;
    auVar69._28_4_ = auVar81._28_4_;
    auVar44 = vfmadd231ps_fma(auVar68,auVar83,ZEXT1632(auVar44));
    auVar49 = vfmadd231ps_fma(auVar69,auVar83,ZEXT1632(auVar49));
    auVar85._0_4_ = fVar202 * auVar80._0_4_;
    auVar85._4_4_ = fVar203 * auVar80._4_4_;
    auVar85._8_4_ = fVar204 * auVar80._8_4_;
    auVar85._12_4_ = fVar205 * auVar80._12_4_;
    auVar85._16_4_ = auVar80._16_4_ * 0.0;
    auVar85._20_4_ = auVar80._20_4_ * 0.0;
    auVar85._24_4_ = auVar80._24_4_ * 0.0;
    auVar85._28_4_ = 0;
    auVar70._4_4_ = fVar203 * auVar72._4_4_;
    auVar70._0_4_ = fVar202 * auVar72._0_4_;
    auVar70._8_4_ = fVar204 * auVar72._8_4_;
    auVar70._12_4_ = fVar205 * auVar72._12_4_;
    auVar70._16_4_ = auVar72._16_4_ * 0.0;
    auVar70._20_4_ = auVar72._20_4_ * 0.0;
    auVar70._24_4_ = auVar72._24_4_ * 0.0;
    auVar70._28_4_ = auVar80._28_4_;
    auVar50 = vfmadd231ps_fma(auVar85,auVar83,auVar67);
    auVar51 = vfmadd231ps_fma(auVar70,auVar83,auVar79);
    auVar72._28_4_ = auVar79._28_4_;
    auVar72._0_28_ =
         ZEXT1628(CONCAT412(fVar205 * auVar51._12_4_,
                            CONCAT48(fVar204 * auVar51._8_4_,
                                     CONCAT44(fVar203 * auVar51._4_4_,fVar202 * auVar51._0_4_))));
    auVar54 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar205 * auVar50._12_4_,
                                                 CONCAT48(fVar204 * auVar50._8_4_,
                                                          CONCAT44(fVar203 * auVar50._4_4_,
                                                                   fVar202 * auVar50._0_4_)))),
                              auVar83,ZEXT1632(auVar44));
    auVar55 = vfmadd231ps_fma(auVar72,auVar83,ZEXT1632(auVar49));
    auVar81 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar44));
    auVar67 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar49));
    auVar68 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar81 = vmulps_avx512vl(auVar81,auVar68);
    auVar67 = vmulps_avx512vl(auVar67,auVar68);
    auVar79._0_4_ = fVar206 * auVar81._0_4_;
    auVar79._4_4_ = fVar206 * auVar81._4_4_;
    auVar79._8_4_ = fVar206 * auVar81._8_4_;
    auVar79._12_4_ = fVar206 * auVar81._12_4_;
    auVar79._16_4_ = fVar206 * auVar81._16_4_;
    auVar79._20_4_ = fVar206 * auVar81._20_4_;
    auVar79._24_4_ = fVar206 * auVar81._24_4_;
    auVar79._28_4_ = 0;
    auVar81 = vmulps_avx512vl(auVar87,auVar67);
    auVar50 = vxorps_avx512vl(auVar71._0_16_,auVar71._0_16_);
    auVar67 = vpermt2ps_avx512vl(ZEXT1632(auVar54),_DAT_0205fd20,ZEXT1632(auVar50));
    auVar69 = vpermt2ps_avx512vl(ZEXT1632(auVar55),_DAT_0205fd20,ZEXT1632(auVar50));
    auVar114._0_4_ = auVar79._0_4_ + auVar54._0_4_;
    auVar114._4_4_ = auVar79._4_4_ + auVar54._4_4_;
    auVar114._8_4_ = auVar79._8_4_ + auVar54._8_4_;
    auVar114._12_4_ = auVar79._12_4_ + auVar54._12_4_;
    auVar114._16_4_ = auVar79._16_4_ + 0.0;
    auVar114._20_4_ = auVar79._20_4_ + 0.0;
    auVar114._24_4_ = auVar79._24_4_ + 0.0;
    auVar114._28_4_ = 0;
    auVar80 = ZEXT1632(auVar50);
    auVar70 = vpermt2ps_avx512vl(auVar79,_DAT_0205fd20,auVar80);
    auVar72 = vaddps_avx512vl(ZEXT1632(auVar55),auVar81);
    auVar71 = vpermt2ps_avx512vl(auVar81,_DAT_0205fd20,auVar80);
    auVar81 = vsubps_avx(auVar67,auVar70);
    auVar70 = vsubps_avx512vl(auVar69,auVar71);
    auVar71 = vmulps_avx512vl(auVar82,auVar86);
    auVar79 = vmulps_avx512vl(auVar76,auVar86);
    auVar71 = vfmadd231ps_avx512vl(auVar71,auVar83,auVar73);
    auVar73 = vfmadd231ps_avx512vl(auVar79,auVar83,auVar75);
    auVar75 = vmulps_avx512vl(auVar84,auVar86);
    auVar79 = vmulps_avx512vl(auVar77,auVar86);
    auVar82 = vfmadd231ps_avx512vl(auVar75,auVar83,auVar82);
    auVar75 = vfmadd231ps_avx512vl(auVar79,auVar83,auVar76);
    auVar76 = vmulps_avx512vl(auVar78,auVar86);
    auVar74 = vmulps_avx512vl(auVar74,auVar86);
    auVar44 = vfmadd231ps_fma(auVar76,auVar83,auVar84);
    auVar49 = vfmadd231ps_fma(auVar74,auVar83,auVar77);
    auVar74 = vmulps_avx512vl(auVar86,auVar82);
    auVar76 = vmulps_avx512vl(ZEXT1632(auVar43),auVar75);
    auVar74 = vfmadd231ps_avx512vl(auVar74,auVar83,auVar71);
    auVar76 = vfmadd231ps_avx512vl(auVar76,auVar83,auVar73);
    auVar82 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar205 * auVar44._12_4_,
                                            CONCAT48(fVar204 * auVar44._8_4_,
                                                     CONCAT44(fVar203 * auVar44._4_4_,
                                                              fVar202 * auVar44._0_4_)))),auVar83,
                         auVar82);
    auVar75 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar205 * auVar49._12_4_,
                                            CONCAT48(fVar204 * auVar49._8_4_,
                                                     CONCAT44(fVar203 * auVar49._4_4_,
                                                              fVar202 * auVar49._0_4_)))),auVar83,
                         auVar75);
    auVar71._4_4_ = fVar203 * auVar82._4_4_;
    auVar71._0_4_ = fVar202 * auVar82._0_4_;
    auVar71._8_4_ = fVar204 * auVar82._8_4_;
    auVar71._12_4_ = fVar205 * auVar82._12_4_;
    auVar71._16_4_ = auVar82._16_4_ * 0.0;
    auVar71._20_4_ = auVar82._20_4_ * 0.0;
    auVar71._24_4_ = auVar82._24_4_ * 0.0;
    auVar71._28_4_ = auVar77._28_4_;
    auVar73._4_4_ = fVar203 * auVar75._4_4_;
    auVar73._0_4_ = fVar202 * auVar75._0_4_;
    auVar73._8_4_ = fVar204 * auVar75._8_4_;
    auVar73._12_4_ = fVar205 * auVar75._12_4_;
    auVar73._16_4_ = auVar75._16_4_ * 0.0;
    auVar73._20_4_ = auVar75._20_4_ * 0.0;
    auVar73._24_4_ = auVar75._24_4_ * 0.0;
    auVar73._28_4_ = auVar84._28_4_;
    auVar71 = vfmadd231ps_avx512vl(auVar71,auVar83,auVar74);
    auVar73 = vfmadd231ps_avx512vl(auVar73,auVar76,auVar83);
    auVar83 = vsubps_avx512vl(auVar82,auVar74);
    auVar82 = vsubps_avx512vl(auVar75,auVar76);
    auVar83 = vmulps_avx512vl(auVar83,auVar68);
    auVar82 = vmulps_avx512vl(auVar82,auVar68);
    fVar190 = fVar206 * auVar83._0_4_;
    fVar202 = fVar206 * auVar83._4_4_;
    auVar84._4_4_ = fVar202;
    auVar84._0_4_ = fVar190;
    fVar203 = fVar206 * auVar83._8_4_;
    auVar84._8_4_ = fVar203;
    fVar204 = fVar206 * auVar83._12_4_;
    auVar84._12_4_ = fVar204;
    fVar205 = fVar206 * auVar83._16_4_;
    auVar84._16_4_ = fVar205;
    fVar207 = fVar206 * auVar83._20_4_;
    auVar84._20_4_ = fVar207;
    fVar206 = fVar206 * auVar83._24_4_;
    auVar84._24_4_ = fVar206;
    auVar84._28_4_ = auVar83._28_4_;
    auVar82 = vmulps_avx512vl(auVar87,auVar82);
    auVar68 = vpermt2ps_avx512vl(auVar71,_DAT_0205fd20,auVar80);
    auVar74 = vpermt2ps_avx512vl(auVar73,_DAT_0205fd20,auVar80);
    auVar188._0_4_ = auVar71._0_4_ + fVar190;
    auVar188._4_4_ = auVar71._4_4_ + fVar202;
    auVar188._8_4_ = auVar71._8_4_ + fVar203;
    auVar188._12_4_ = auVar71._12_4_ + fVar204;
    auVar188._16_4_ = auVar71._16_4_ + fVar205;
    auVar188._20_4_ = auVar71._20_4_ + fVar207;
    auVar188._24_4_ = auVar71._24_4_ + fVar206;
    auVar188._28_4_ = auVar71._28_4_ + auVar83._28_4_;
    auVar83 = vpermt2ps_avx512vl(auVar84,_DAT_0205fd20,ZEXT1632(auVar50));
    auVar84 = vaddps_avx512vl(auVar73,auVar82);
    auVar82 = vpermt2ps_avx512vl(auVar82,_DAT_0205fd20,ZEXT1632(auVar50));
    auVar83 = vsubps_avx(auVar68,auVar83);
    auVar82 = vsubps_avx512vl(auVar74,auVar82);
    auVar135 = ZEXT1632(auVar54);
    auVar75 = vsubps_avx512vl(auVar71,auVar135);
    auVar136 = ZEXT1632(auVar55);
    auVar76 = vsubps_avx512vl(auVar73,auVar136);
    auVar77 = vsubps_avx512vl(auVar68,auVar67);
    auVar75 = vaddps_avx512vl(auVar75,auVar77);
    auVar77 = vsubps_avx512vl(auVar74,auVar69);
    auVar76 = vaddps_avx512vl(auVar76,auVar77);
    auVar77 = vmulps_avx512vl(auVar136,auVar75);
    auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar135,auVar76);
    auVar78 = vmulps_avx512vl(auVar72,auVar75);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar114,auVar76);
    auVar79 = vmulps_avx512vl(auVar70,auVar75);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar81,auVar76);
    auVar80 = vmulps_avx512vl(auVar69,auVar75);
    auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar67,auVar76);
    auVar85 = vmulps_avx512vl(auVar73,auVar75);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar71,auVar76);
    auVar86 = vmulps_avx512vl(auVar84,auVar75);
    auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar188,auVar76);
    auVar87 = vmulps_avx512vl(auVar82,auVar75);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar83,auVar76);
    auVar75 = vmulps_avx512vl(auVar74,auVar75);
    auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar68,auVar76);
    auVar76 = vminps_avx512vl(auVar77,auVar78);
    auVar77 = vmaxps_avx512vl(auVar77,auVar78);
    auVar78 = vminps_avx512vl(auVar79,auVar80);
    auVar76 = vminps_avx512vl(auVar76,auVar78);
    auVar78 = vmaxps_avx512vl(auVar79,auVar80);
    auVar77 = vmaxps_avx512vl(auVar77,auVar78);
    auVar78 = vminps_avx512vl(auVar85,auVar86);
    auVar79 = vmaxps_avx512vl(auVar85,auVar86);
    auVar80 = vminps_avx512vl(auVar87,auVar75);
    auVar78 = vminps_avx512vl(auVar78,auVar80);
    auVar76 = vminps_avx512vl(auVar76,auVar78);
    auVar75 = vmaxps_avx512vl(auVar87,auVar75);
    auVar75 = vmaxps_avx512vl(auVar79,auVar75);
    auVar75 = vmaxps_avx512vl(auVar77,auVar75);
    uVar16 = vcmpps_avx512vl(auVar76,local_1c0,2);
    uVar17 = vcmpps_avx512vl(auVar75,local_1e0,5);
    uVar27 = 0;
    bVar23 = (byte)uVar16 & (byte)uVar17 & 0x7f;
    if (bVar23 != 0) {
      auVar75 = vsubps_avx512vl(auVar67,auVar135);
      auVar76 = vsubps_avx512vl(auVar69,auVar136);
      auVar77 = vsubps_avx512vl(auVar68,auVar71);
      auVar75 = vaddps_avx512vl(auVar75,auVar77);
      auVar77 = vsubps_avx512vl(auVar74,auVar73);
      auVar76 = vaddps_avx512vl(auVar76,auVar77);
      auVar77 = vmulps_avx512vl(auVar136,auVar75);
      auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar76,auVar135);
      auVar72 = vmulps_avx512vl(auVar72,auVar75);
      auVar72 = vfnmadd213ps_avx512vl(auVar114,auVar76,auVar72);
      auVar70 = vmulps_avx512vl(auVar70,auVar75);
      auVar70 = vfnmadd213ps_avx512vl(auVar81,auVar76,auVar70);
      auVar81 = vmulps_avx512vl(auVar69,auVar75);
      auVar69 = vfnmadd231ps_avx512vl(auVar81,auVar76,auVar67);
      auVar81 = vmulps_avx512vl(auVar73,auVar75);
      auVar71 = vfnmadd231ps_avx512vl(auVar81,auVar76,auVar71);
      auVar81 = vmulps_avx512vl(auVar84,auVar75);
      auVar84 = vfnmadd213ps_avx512vl(auVar188,auVar76,auVar81);
      auVar81 = vmulps_avx512vl(auVar82,auVar75);
      auVar73 = vfnmadd213ps_avx512vl(auVar83,auVar76,auVar81);
      auVar83 = vmulps_avx512vl(auVar74,auVar75);
      auVar68 = vfnmadd231ps_avx512vl(auVar83,auVar68,auVar76);
      auVar81 = vminps_avx(auVar77,auVar72);
      auVar83 = vmaxps_avx(auVar77,auVar72);
      auVar67 = vminps_avx(auVar70,auVar69);
      auVar67 = vminps_avx(auVar81,auVar67);
      auVar81 = vmaxps_avx(auVar70,auVar69);
      auVar83 = vmaxps_avx(auVar83,auVar81);
      auVar82 = vminps_avx(auVar71,auVar84);
      auVar81 = vmaxps_avx(auVar71,auVar84);
      auVar84 = vminps_avx(auVar73,auVar68);
      auVar82 = vminps_avx(auVar82,auVar84);
      auVar82 = vminps_avx(auVar67,auVar82);
      auVar67 = vmaxps_avx(auVar73,auVar68);
      auVar81 = vmaxps_avx(auVar81,auVar67);
      auVar83 = vmaxps_avx(auVar83,auVar81);
      uVar16 = vcmpps_avx512vl(auVar83,local_1e0,5);
      uVar17 = vcmpps_avx512vl(auVar82,local_1c0,2);
      uVar27 = (uint)(bVar23 & (byte)uVar16 & (byte)uVar17);
    }
    if (uVar27 != 0) {
      auStack_420[uVar25] = uVar27;
      uVar16 = vmovlps_avx(auVar39);
      *(undefined8 *)(&uStack_260 + uVar25 * 2) = uVar16;
      uVar29 = vmovlps_avx512f(auVar52);
      auStack_1a0[uVar25] = uVar29;
      uVar25 = (ulong)((int)uVar25 + 1);
    }
    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar239 = ZEXT1664(auVar39);
    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar240 = ZEXT1664(auVar39);
    auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    in_ZMM19 = ZEXT3264(auVar83);
    auVar241 = ZEXT464(0x3f800000);
    do {
      auVar43 = auVar243._0_16_;
      auVar39 = auVar239._0_16_;
      if ((int)uVar25 == 0) {
        if (bVar32) {
          return local_591;
        }
        uVar101 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar20._4_4_ = uVar101;
        auVar20._0_4_ = uVar101;
        auVar20._8_4_ = uVar101;
        auVar20._12_4_ = uVar101;
        uVar16 = vcmpps_avx512vl(local_380,auVar20,2);
        uVar31 = (uint)uVar34 & (uint)uVar34 + 0xf & (uint)uVar16;
        uVar34 = (ulong)uVar31;
        local_591 = uVar31 != 0;
        if (!local_591) {
          return local_591;
        }
        goto LAB_01b41043;
      }
      uVar24 = (int)uVar25 - 1;
      uVar26 = (ulong)uVar24;
      uVar27 = (&uStack_260)[uVar26 * 2];
      fVar206 = afStack_25c[uVar26 * 2];
      uVar4 = auStack_420[uVar26];
      auVar220._8_8_ = 0;
      auVar220._0_8_ = auStack_1a0[uVar26];
      auVar226 = ZEXT1664(auVar220);
      lVar30 = 0;
      for (uVar29 = (ulong)uVar4; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
        lVar30 = lVar30 + 1;
      }
      uVar28 = uVar4 - 1 & uVar4;
      auStack_420[uVar26] = uVar28;
      if (uVar28 == 0) {
        uVar25 = (ulong)uVar24;
      }
      auVar44 = vcvtsi2ss_avx512f(auVar43,lVar30);
      auVar49 = vmulss_avx512f(auVar44,SUB6416(ZEXT464(0x3e124925),0));
      lVar30 = lVar30 + 1;
      auVar44 = vcvtsi2ss_avx512f(auVar43,lVar30);
      auVar44 = vmulss_avx512f(auVar44,SUB6416(ZEXT464(0x3e124925),0));
      auVar51 = auVar241._0_16_;
      auVar50 = vsubss_avx512f(auVar51,auVar49);
      auVar49 = vmulss_avx512f(ZEXT416((uint)fVar206),auVar49);
      auVar49 = vfmadd231ss_avx512f(auVar49,ZEXT416(uVar27),auVar50);
      auVar50 = vsubss_avx512f(auVar51,auVar44);
      auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * auVar44._0_4_)),ZEXT416(uVar27),auVar50);
      auVar50 = vsubss_avx512f(auVar44,auVar49);
      vucomiss_avx512f(auVar50);
      if (uVar4 == 0 || lVar30 == 0) break;
      auVar54 = vshufps_avx(auVar220,auVar220,0x50);
      vucomiss_avx512f(auVar50);
      auVar52 = vsubps_avx512vl(auVar43,auVar54);
      fVar206 = auVar54._0_4_;
      auVar130._0_4_ = fVar183 * fVar206;
      fVar190 = auVar54._4_4_;
      auVar130._4_4_ = fVar189 * fVar190;
      fVar202 = auVar54._8_4_;
      auVar130._8_4_ = fVar183 * fVar202;
      fVar203 = auVar54._12_4_;
      auVar130._12_4_ = fVar189 * fVar203;
      auVar142._0_4_ = fVar162 * fVar206;
      auVar142._4_4_ = fVar173 * fVar190;
      auVar142._8_4_ = fVar162 * fVar202;
      auVar142._12_4_ = fVar173 * fVar203;
      auVar152._0_4_ = fVar215 * fVar206;
      auVar152._4_4_ = fVar216 * fVar190;
      auVar152._8_4_ = fVar215 * fVar202;
      auVar152._12_4_ = fVar216 * fVar203;
      auVar109._0_4_ = fVar217 * fVar206;
      auVar109._4_4_ = fVar218 * fVar190;
      auVar109._8_4_ = fVar217 * fVar202;
      auVar109._12_4_ = fVar218 * fVar203;
      auVar54 = vfmadd231ps_fma(auVar130,auVar52,auVar48);
      auVar55 = vfmadd231ps_fma(auVar142,auVar52,auVar41);
      auVar53 = vfmadd231ps_avx512vl(auVar152,auVar52,auVar107);
      auVar52 = vfmadd231ps_fma(auVar109,auVar176,auVar52);
      auVar77._16_16_ = auVar54;
      auVar77._0_16_ = auVar54;
      auVar136._16_16_ = auVar55;
      auVar136._0_16_ = auVar55;
      auVar145._16_16_ = auVar53;
      auVar145._0_16_ = auVar53;
      auVar161._0_4_ = auVar49._0_4_;
      auVar161._4_4_ = auVar161._0_4_;
      auVar161._8_4_ = auVar161._0_4_;
      auVar161._12_4_ = auVar161._0_4_;
      uVar101 = auVar44._0_4_;
      auVar161._20_4_ = uVar101;
      auVar161._16_4_ = uVar101;
      auVar161._24_4_ = uVar101;
      auVar161._28_4_ = uVar101;
      auVar83 = vsubps_avx(auVar136,auVar77);
      auVar55 = vfmadd213ps_fma(auVar83,auVar161,auVar77);
      auVar83 = vsubps_avx(auVar145,auVar136);
      auVar65 = vfmadd213ps_fma(auVar83,auVar161,auVar136);
      auVar54 = vsubps_avx(auVar52,auVar53);
      auVar137._16_16_ = auVar54;
      auVar137._0_16_ = auVar54;
      auVar54 = vfmadd213ps_fma(auVar137,auVar161,auVar145);
      auVar83 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar55));
      auVar55 = vfmadd213ps_fma(auVar83,auVar161,ZEXT1632(auVar55));
      auVar83 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar65));
      auVar54 = vfmadd213ps_fma(auVar83,auVar161,ZEXT1632(auVar65));
      auVar83 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar55));
      auVar60 = vfmadd231ps_fma(ZEXT1632(auVar55),auVar83,auVar161);
      auVar83 = vmulps_avx512vl(auVar83,in_ZMM19._0_32_);
      auVar76._16_16_ = auVar83._16_16_;
      auVar54 = vmulss_avx512f(auVar50,SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar206 = auVar54._0_4_;
      auVar153._0_8_ =
           CONCAT44(auVar60._4_4_ + fVar206 * auVar83._4_4_,auVar60._0_4_ + fVar206 * auVar83._0_4_)
      ;
      auVar153._8_4_ = auVar60._8_4_ + fVar206 * auVar83._8_4_;
      auVar153._12_4_ = auVar60._12_4_ + fVar206 * auVar83._12_4_;
      auVar131._0_4_ = fVar206 * auVar83._16_4_;
      auVar131._4_4_ = fVar206 * auVar83._20_4_;
      auVar131._8_4_ = fVar206 * auVar83._24_4_;
      auVar131._12_4_ = fVar206 * auVar83._28_4_;
      auVar66 = vsubps_avx((undefined1  [16])0x0,auVar131);
      auVar63 = vshufpd_avx(auVar60,auVar60,3);
      auVar61 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar54 = vsubps_avx(auVar63,auVar60);
      auVar55 = vsubps_avx(auVar61,(undefined1  [16])0x0);
      auVar163._0_4_ = auVar55._0_4_ + auVar54._0_4_;
      auVar163._4_4_ = auVar55._4_4_ + auVar54._4_4_;
      auVar163._8_4_ = auVar55._8_4_ + auVar54._8_4_;
      auVar163._12_4_ = auVar55._12_4_ + auVar54._12_4_;
      auVar54 = vshufps_avx(auVar60,auVar60,0xb1);
      auVar55 = vshufps_avx(auVar153,auVar153,0xb1);
      auVar52 = vshufps_avx(auVar66,auVar66,0xb1);
      auVar65 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar221._4_4_ = auVar163._0_4_;
      auVar221._0_4_ = auVar163._0_4_;
      auVar221._8_4_ = auVar163._0_4_;
      auVar221._12_4_ = auVar163._0_4_;
      auVar53 = vshufps_avx(auVar163,auVar163,0x55);
      fVar206 = auVar53._0_4_;
      auVar177._0_4_ = auVar54._0_4_ * fVar206;
      fVar190 = auVar53._4_4_;
      auVar177._4_4_ = auVar54._4_4_ * fVar190;
      fVar202 = auVar53._8_4_;
      auVar177._8_4_ = auVar54._8_4_ * fVar202;
      fVar203 = auVar53._12_4_;
      auVar177._12_4_ = auVar54._12_4_ * fVar203;
      auVar185._0_4_ = auVar55._0_4_ * fVar206;
      auVar185._4_4_ = auVar55._4_4_ * fVar190;
      auVar185._8_4_ = auVar55._8_4_ * fVar202;
      auVar185._12_4_ = auVar55._12_4_ * fVar203;
      auVar194._0_4_ = auVar52._0_4_ * fVar206;
      auVar194._4_4_ = auVar52._4_4_ * fVar190;
      auVar194._8_4_ = auVar52._8_4_ * fVar202;
      auVar194._12_4_ = auVar52._12_4_ * fVar203;
      auVar164._0_4_ = auVar65._0_4_ * fVar206;
      auVar164._4_4_ = auVar65._4_4_ * fVar190;
      auVar164._8_4_ = auVar65._8_4_ * fVar202;
      auVar164._12_4_ = auVar65._12_4_ * fVar203;
      auVar54 = vfmadd231ps_fma(auVar177,auVar221,auVar60);
      auVar55 = vfmadd231ps_fma(auVar185,auVar221,auVar153);
      auVar53 = vfmadd231ps_fma(auVar194,auVar221,auVar66);
      auVar59 = vfmadd231ps_fma(auVar164,(undefined1  [16])0x0,auVar221);
      auVar62 = vshufpd_avx(auVar54,auVar54,1);
      auVar56 = vshufpd_avx(auVar55,auVar55,1);
      auVar57 = vshufpd_avx(auVar53,auVar53,1);
      auVar58 = vshufpd_avx(auVar59,auVar59,1);
      auVar52 = vminss_avx(auVar54,auVar55);
      auVar54 = vmaxss_avx(auVar55,auVar54);
      auVar65 = vminss_avx(auVar53,auVar59);
      auVar55 = vmaxss_avx(auVar59,auVar53);
      auVar65 = vminss_avx(auVar52,auVar65);
      auVar54 = vmaxss_avx(auVar55,auVar54);
      auVar53 = vminss_avx(auVar62,auVar56);
      auVar55 = vmaxss_avx(auVar56,auVar62);
      auVar62 = vminss_avx(auVar57,auVar58);
      auVar52 = vmaxss_avx(auVar58,auVar57);
      auVar53 = vminss_avx(auVar53,auVar62);
      auVar55 = vmaxss_avx(auVar52,auVar55);
      vucomiss_avx512f(auVar65);
      fVar190 = auVar55._0_4_;
      fVar206 = auVar54._0_4_;
      if (((uint)uVar25 < 5) || (fVar190 <= -0.0001)) {
        uVar16 = vcmpps_avx512vl(auVar53,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar17 = vcmpps_avx512vl(auVar65,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar206 & ((byte)uVar17 | (byte)uVar16)) != 0) goto LAB_01b41f39;
        uVar16 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar55,5);
        uVar17 = vcmpps_avx512vl(auVar53,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar17 | (ushort)uVar16) & 1) == 0) goto LAB_01b41f39;
LAB_01b42d1b:
        bVar18 = true;
        auVar226 = ZEXT1664(auVar220);
      }
      else {
LAB_01b41f39:
        auVar56 = auVar245._0_16_;
        uVar16 = vcmpss_avx512f(auVar65,auVar56,1);
        bVar18 = (bool)((byte)uVar16 & 1);
        iVar99 = auVar241._0_4_;
        fVar202 = (float)((uint)bVar18 * -0x40800000 + (uint)!bVar18 * iVar99);
        uVar16 = vcmpss_avx512f(auVar54,auVar56,1);
        bVar18 = (bool)((byte)uVar16 & 1);
        fVar203 = (float)((uint)bVar18 * -0x40800000 + (uint)!bVar18 * iVar99);
        bVar18 = fVar202 != fVar203;
        iVar244 = auVar245._0_4_;
        auVar76._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar88._4_28_ = auVar76._4_28_;
        auVar88._0_4_ = (uint)bVar18 * iVar244 + (uint)!bVar18 * 0x7f800000;
        auVar62 = auVar88._0_16_;
        auVar90._16_16_ = auVar76._16_16_;
        auVar90._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar89._4_28_ = auVar90._4_28_;
        auVar89._0_4_ = (uint)bVar18 * iVar244 + (uint)!bVar18 * -0x800000;
        auVar52 = auVar89._0_16_;
        uVar16 = vcmpss_avx512f(auVar53,auVar56,1);
        bVar18 = (bool)((byte)uVar16 & 1);
        fVar204 = (float)((uint)bVar18 * -0x40800000 + (uint)!bVar18 * iVar99);
        if ((fVar202 != fVar204) || (NAN(fVar202) || NAN(fVar204))) {
          fVar205 = auVar53._0_4_;
          fVar202 = auVar65._0_4_;
          bVar18 = fVar205 == fVar202;
          if ((!bVar18) || (NAN(fVar205) || NAN(fVar202))) {
            auVar65 = vxorps_avx512vl(auVar65,auVar240._0_16_);
            auVar234._0_4_ = auVar65._0_4_ / (fVar205 - fVar202);
            auVar234._4_12_ = auVar65._4_12_;
            auVar65 = vsubss_avx512f(auVar51,auVar234);
            auVar53 = vfmadd213ss_avx512f(auVar65,auVar56,auVar234);
            auVar65 = auVar53;
          }
          else {
            vucomiss_avx512f(auVar56);
            auVar92._16_16_ = auVar76._16_16_;
            auVar92._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar91._4_28_ = auVar92._4_28_;
            auVar91._0_4_ = (uint)bVar18 * iVar244 + (uint)!bVar18 * 0x7f800000;
            auVar53 = auVar91._0_16_;
            auVar65 = ZEXT416((uint)bVar18 * 0x3f800000 + (uint)!bVar18 * -0x800000);
          }
          auVar62 = vminss_avx(auVar62,auVar53);
          auVar52 = vmaxss_avx(auVar65,auVar52);
        }
        uVar16 = vcmpss_avx512f(auVar55,auVar56,1);
        bVar18 = (bool)((byte)uVar16 & 1);
        fVar202 = (float)((uint)bVar18 * -0x40800000 + (uint)!bVar18 * iVar99);
        if ((fVar203 != fVar202) || (NAN(fVar203) || NAN(fVar202))) {
          bVar18 = fVar190 == fVar206;
          if ((!bVar18) || (NAN(fVar190) || NAN(fVar206))) {
            auVar54 = vxorps_avx512vl(auVar54,auVar240._0_16_);
            auVar195._0_4_ = auVar54._0_4_ / (fVar190 - fVar206);
            auVar195._4_12_ = auVar54._4_12_;
            auVar54 = vsubss_avx512f(auVar51,auVar195);
            auVar55 = vfmadd213ss_avx512f(auVar54,auVar56,auVar195);
            auVar54 = auVar55;
          }
          else {
            vucomiss_avx512f(auVar56);
            auVar94._16_16_ = auVar76._16_16_;
            auVar94._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar93._4_28_ = auVar94._4_28_;
            auVar93._0_4_ = (uint)bVar18 * iVar244 + (uint)!bVar18 * 0x7f800000;
            auVar55 = auVar93._0_16_;
            auVar54 = ZEXT416((uint)bVar18 * 0x3f800000 + (uint)!bVar18 * -0x800000);
          }
          auVar62 = vminss_avx(auVar62,auVar55);
          auVar52 = vmaxss_avx(auVar54,auVar52);
        }
        bVar18 = fVar204 != fVar202;
        auVar54 = vminss_avx512f(auVar62,auVar51);
        auVar96._16_16_ = auVar76._16_16_;
        auVar96._0_16_ = auVar62;
        auVar95._4_28_ = auVar96._4_28_;
        auVar95._0_4_ = (uint)bVar18 * auVar54._0_4_ + (uint)!bVar18 * auVar62._0_4_;
        auVar54 = vmaxss_avx512f(auVar51,auVar52);
        auVar98._16_16_ = auVar76._16_16_;
        auVar98._0_16_ = auVar52;
        auVar97._4_28_ = auVar98._4_28_;
        auVar97._0_4_ = (uint)bVar18 * auVar54._0_4_ + (uint)!bVar18 * auVar52._0_4_;
        auVar54 = vmaxss_avx512f(auVar56,auVar95._0_16_);
        auVar55 = vminss_avx512f(auVar97._0_16_,auVar51);
        bVar18 = true;
        if (auVar55._0_4_ < auVar54._0_4_) goto LAB_01b42d1b;
        auVar56 = vmaxss_avx512f(auVar56,ZEXT416((uint)(auVar54._0_4_ + -0.1)));
        auVar57 = vminss_avx512f(ZEXT416((uint)(auVar55._0_4_ + 0.1)),auVar51);
        auVar110._0_8_ = auVar60._0_8_;
        auVar110._8_8_ = auVar110._0_8_;
        auVar186._8_8_ = auVar153._0_8_;
        auVar186._0_8_ = auVar153._0_8_;
        auVar196._8_8_ = auVar66._0_8_;
        auVar196._0_8_ = auVar66._0_8_;
        auVar54 = vshufpd_avx(auVar153,auVar153,3);
        auVar55 = vshufpd_avx(auVar66,auVar66,3);
        auVar52 = vshufps_avx(auVar56,auVar57,0);
        auVar58 = vsubps_avx512vl(auVar43,auVar52);
        fVar206 = auVar52._0_4_;
        auVar232._0_4_ = fVar206 * auVar63._0_4_;
        fVar190 = auVar52._4_4_;
        auVar232._4_4_ = fVar190 * auVar63._4_4_;
        fVar202 = auVar52._8_4_;
        auVar232._8_4_ = fVar202 * auVar63._8_4_;
        fVar203 = auVar52._12_4_;
        auVar232._12_4_ = fVar203 * auVar63._12_4_;
        auVar154._0_4_ = fVar206 * auVar54._0_4_;
        auVar154._4_4_ = fVar190 * auVar54._4_4_;
        auVar154._8_4_ = fVar202 * auVar54._8_4_;
        auVar154._12_4_ = fVar203 * auVar54._12_4_;
        auVar158._0_4_ = fVar206 * auVar55._0_4_;
        auVar158._4_4_ = fVar190 * auVar55._4_4_;
        auVar158._8_4_ = fVar202 * auVar55._8_4_;
        auVar158._12_4_ = fVar203 * auVar55._12_4_;
        auVar132._0_4_ = fVar206 * auVar61._0_4_;
        auVar132._4_4_ = fVar190 * auVar61._4_4_;
        auVar132._8_4_ = fVar202 * auVar61._8_4_;
        auVar132._12_4_ = fVar203 * auVar61._12_4_;
        auVar65 = vfmadd231ps_fma(auVar232,auVar58,auVar110);
        auVar53 = vfmadd231ps_fma(auVar154,auVar58,auVar186);
        auVar62 = vfmadd231ps_fma(auVar158,auVar58,auVar196);
        auVar63 = vfmadd231ps_fma(auVar132,auVar58,ZEXT816(0));
        auVar54 = vsubss_avx512f(auVar51,auVar56);
        auVar55 = vmovshdup_avx512vl(auVar220);
        auVar59 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar55._0_4_ * auVar56._0_4_)),auVar220,
                                      auVar54);
        auVar54 = vsubss_avx512f(auVar51,auVar57);
        auVar60 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar57._0_4_ * auVar55._0_4_)),auVar220,
                                      auVar54);
        auVar61 = vdivss_avx512f(auVar51,auVar50);
        auVar50 = vsubps_avx(auVar53,auVar65);
        auVar55 = vmulps_avx512vl(auVar50,auVar39);
        auVar50 = vsubps_avx(auVar62,auVar53);
        auVar52 = vmulps_avx512vl(auVar50,auVar39);
        auVar50 = vsubps_avx(auVar63,auVar62);
        auVar50 = vmulps_avx512vl(auVar50,auVar39);
        auVar54 = vminps_avx(auVar52,auVar50);
        auVar50 = vmaxps_avx(auVar52,auVar50);
        auVar54 = vminps_avx(auVar55,auVar54);
        auVar50 = vmaxps_avx(auVar55,auVar50);
        auVar55 = vshufpd_avx(auVar54,auVar54,3);
        auVar52 = vshufpd_avx(auVar50,auVar50,3);
        auVar54 = vminps_avx(auVar54,auVar55);
        auVar50 = vmaxps_avx(auVar50,auVar52);
        fVar206 = auVar61._0_4_;
        auVar178._0_4_ = fVar206 * auVar54._0_4_;
        auVar178._4_4_ = fVar206 * auVar54._4_4_;
        auVar178._8_4_ = fVar206 * auVar54._8_4_;
        auVar178._12_4_ = fVar206 * auVar54._12_4_;
        auVar165._0_4_ = fVar206 * auVar50._0_4_;
        auVar165._4_4_ = fVar206 * auVar50._4_4_;
        auVar165._8_4_ = fVar206 * auVar50._8_4_;
        auVar165._12_4_ = fVar206 * auVar50._12_4_;
        auVar61 = vdivss_avx512f(auVar51,ZEXT416((uint)(auVar60._0_4_ - auVar59._0_4_)));
        auVar50 = vshufpd_avx(auVar65,auVar65,3);
        auVar54 = vshufpd_avx(auVar53,auVar53,3);
        auVar55 = vshufpd_avx(auVar62,auVar62,3);
        auVar52 = vshufpd_avx(auVar63,auVar63,3);
        auVar50 = vsubps_avx(auVar50,auVar65);
        auVar65 = vsubps_avx(auVar54,auVar53);
        auVar53 = vsubps_avx(auVar55,auVar62);
        auVar52 = vsubps_avx(auVar52,auVar63);
        auVar54 = vminps_avx(auVar50,auVar65);
        auVar50 = vmaxps_avx(auVar50,auVar65);
        auVar55 = vminps_avx(auVar53,auVar52);
        auVar55 = vminps_avx(auVar54,auVar55);
        auVar54 = vmaxps_avx(auVar53,auVar52);
        auVar50 = vmaxps_avx(auVar50,auVar54);
        fVar206 = auVar61._0_4_;
        auVar197._0_4_ = fVar206 * auVar55._0_4_;
        auVar197._4_4_ = fVar206 * auVar55._4_4_;
        auVar197._8_4_ = fVar206 * auVar55._8_4_;
        auVar197._12_4_ = fVar206 * auVar55._12_4_;
        auVar209._0_4_ = fVar206 * auVar50._0_4_;
        auVar209._4_4_ = fVar206 * auVar50._4_4_;
        auVar209._8_4_ = fVar206 * auVar50._8_4_;
        auVar209._12_4_ = fVar206 * auVar50._12_4_;
        auVar66 = vinsertps_avx512f(auVar49,auVar59,0x10);
        auVar65 = vinsertps_avx(auVar44,auVar60,0x10);
        auVar103._0_4_ = auVar66._0_4_ + auVar65._0_4_;
        auVar103._4_4_ = auVar66._4_4_ + auVar65._4_4_;
        auVar103._8_4_ = auVar66._8_4_ + auVar65._8_4_;
        auVar103._12_4_ = auVar66._12_4_ + auVar65._12_4_;
        auVar19._8_4_ = 0x3f000000;
        auVar19._0_8_ = 0x3f0000003f000000;
        auVar19._12_4_ = 0x3f000000;
        auVar57 = vmulps_avx512vl(auVar103,auVar19);
        auVar55 = vshufps_avx(auVar57,auVar57,0x54);
        uVar101 = auVar57._0_4_;
        auVar125._4_4_ = uVar101;
        auVar125._0_4_ = uVar101;
        auVar125._8_4_ = uVar101;
        auVar125._12_4_ = uVar101;
        auVar54 = vfmadd213ps_fma(auVar38,auVar125,auVar35);
        auVar53 = vfmadd213ps_avx512vl(auVar37,auVar125,auVar40);
        auVar52 = vfmadd213ps_fma(local_270,auVar125,auVar36);
        auVar50 = vsubps_avx(auVar53,auVar54);
        auVar54 = vfmadd213ps_fma(auVar50,auVar125,auVar54);
        auVar50 = vsubps_avx(auVar52,auVar53);
        auVar50 = vfmadd213ps_fma(auVar50,auVar125,auVar53);
        auVar50 = vsubps_avx(auVar50,auVar54);
        auVar54 = vfmadd231ps_fma(auVar54,auVar50,auVar125);
        auVar62 = vmulps_avx512vl(auVar50,auVar39);
        auVar222._8_8_ = auVar54._0_8_;
        auVar222._0_8_ = auVar54._0_8_;
        auVar50 = vshufpd_avx(auVar54,auVar54,3);
        auVar54 = vshufps_avx(auVar57,auVar57,0x55);
        auVar52 = vsubps_avx(auVar50,auVar222);
        auVar53 = vfmadd231ps_fma(auVar222,auVar54,auVar52);
        auVar235._8_8_ = auVar62._0_8_;
        auVar235._0_8_ = auVar62._0_8_;
        auVar50 = vshufpd_avx(auVar62,auVar62,3);
        auVar50 = vsubps_avx(auVar50,auVar235);
        auVar54 = vfmadd213ps_fma(auVar50,auVar54,auVar235);
        auVar126._0_8_ = auVar52._0_8_ ^ 0x8000000080000000;
        auVar126._8_4_ = auVar52._8_4_ ^ 0x80000000;
        auVar126._12_4_ = auVar52._12_4_ ^ 0x80000000;
        auVar50 = vmovshdup_avx(auVar54);
        auVar236._0_8_ = auVar50._0_8_ ^ 0x8000000080000000;
        auVar236._8_4_ = auVar50._8_4_ ^ 0x80000000;
        auVar236._12_4_ = auVar50._12_4_ ^ 0x80000000;
        auVar62 = vmovshdup_avx512vl(auVar52);
        auVar63 = vpermt2ps_avx512vl(auVar236,ZEXT416(5),auVar52);
        auVar50 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar50._0_4_ * auVar52._0_4_)),auVar54,auVar62
                                     );
        auVar54 = vpermt2ps_avx512vl(auVar54,SUB6416(ZEXT464(4),0),auVar126);
        auVar133._0_4_ = auVar50._0_4_;
        auVar133._4_4_ = auVar133._0_4_;
        auVar133._8_4_ = auVar133._0_4_;
        auVar133._12_4_ = auVar133._0_4_;
        auVar50 = vdivps_avx(auVar63,auVar133);
        auVar54 = vdivps_avx(auVar54,auVar133);
        fVar190 = auVar53._0_4_;
        auVar52 = vshufps_avx(auVar53,auVar53,0x55);
        fVar206 = auVar54._0_4_;
        auVar223._0_4_ = fVar190 * auVar50._0_4_ + auVar52._0_4_ * fVar206;
        auVar223._4_4_ = fVar190 * auVar50._4_4_ + auVar52._4_4_ * auVar54._4_4_;
        auVar223._8_4_ = fVar190 * auVar50._8_4_ + auVar52._8_4_ * auVar54._8_4_;
        auVar223._12_4_ = fVar190 * auVar50._12_4_ + auVar52._12_4_ * auVar54._12_4_;
        auVar58 = vsubps_avx(auVar55,auVar223);
        auVar53 = vmovshdup_avx(auVar50);
        auVar55 = vinsertps_avx(auVar178,auVar197,0x1c);
        auVar237._0_4_ = auVar53._0_4_ * auVar55._0_4_;
        auVar237._4_4_ = auVar53._4_4_ * auVar55._4_4_;
        auVar237._8_4_ = auVar53._8_4_ * auVar55._8_4_;
        auVar237._12_4_ = auVar53._12_4_ * auVar55._12_4_;
        auVar52 = vinsertps_avx(auVar165,auVar209,0x1c);
        auVar224._0_4_ = auVar53._0_4_ * auVar52._0_4_;
        auVar224._4_4_ = auVar53._4_4_ * auVar52._4_4_;
        auVar224._8_4_ = auVar53._8_4_ * auVar52._8_4_;
        auVar224._12_4_ = auVar53._12_4_ * auVar52._12_4_;
        auVar56 = vminps_avx512vl(auVar237,auVar224);
        auVar63 = vmaxps_avx(auVar224,auVar237);
        auVar61 = vmovshdup_avx(auVar54);
        auVar53 = vinsertps_avx(auVar197,auVar178,0x4c);
        auVar198._0_4_ = auVar61._0_4_ * auVar53._0_4_;
        auVar198._4_4_ = auVar61._4_4_ * auVar53._4_4_;
        auVar198._8_4_ = auVar61._8_4_ * auVar53._8_4_;
        auVar198._12_4_ = auVar61._12_4_ * auVar53._12_4_;
        auVar62 = vinsertps_avx(auVar209,auVar165,0x4c);
        auVar210._0_4_ = auVar61._0_4_ * auVar62._0_4_;
        auVar210._4_4_ = auVar61._4_4_ * auVar62._4_4_;
        auVar210._8_4_ = auVar61._8_4_ * auVar62._8_4_;
        auVar210._12_4_ = auVar61._12_4_ * auVar62._12_4_;
        auVar61 = vminps_avx(auVar198,auVar210);
        auVar56 = vaddps_avx512vl(auVar56,auVar61);
        auVar61 = vmaxps_avx(auVar210,auVar198);
        auVar199._0_4_ = auVar63._0_4_ + auVar61._0_4_;
        auVar199._4_4_ = auVar63._4_4_ + auVar61._4_4_;
        auVar199._8_4_ = auVar63._8_4_ + auVar61._8_4_;
        auVar199._12_4_ = auVar63._12_4_ + auVar61._12_4_;
        auVar211._8_8_ = 0x3f80000000000000;
        auVar211._0_8_ = 0x3f80000000000000;
        auVar63 = vsubps_avx(auVar211,auVar199);
        auVar61 = vsubps_avx(auVar211,auVar56);
        auVar56 = vsubps_avx(auVar66,auVar57);
        auVar57 = vsubps_avx(auVar65,auVar57);
        fVar205 = auVar56._0_4_;
        auVar238._0_4_ = fVar205 * auVar63._0_4_;
        fVar207 = auVar56._4_4_;
        auVar238._4_4_ = fVar207 * auVar63._4_4_;
        fVar227 = auVar56._8_4_;
        auVar238._8_4_ = fVar227 * auVar63._8_4_;
        fVar228 = auVar56._12_4_;
        auVar238._12_4_ = fVar228 * auVar63._12_4_;
        auVar64 = vbroadcastss_avx512vl(auVar50);
        auVar55 = vmulps_avx512vl(auVar64,auVar55);
        auVar52 = vmulps_avx512vl(auVar64,auVar52);
        auVar64 = vminps_avx512vl(auVar55,auVar52);
        auVar55 = vmaxps_avx(auVar52,auVar55);
        auVar179._0_4_ = fVar206 * auVar53._0_4_;
        auVar179._4_4_ = fVar206 * auVar53._4_4_;
        auVar179._8_4_ = fVar206 * auVar53._8_4_;
        auVar179._12_4_ = fVar206 * auVar53._12_4_;
        auVar166._0_4_ = fVar206 * auVar62._0_4_;
        auVar166._4_4_ = fVar206 * auVar62._4_4_;
        auVar166._8_4_ = fVar206 * auVar62._8_4_;
        auVar166._12_4_ = fVar206 * auVar62._12_4_;
        auVar52 = vminps_avx(auVar179,auVar166);
        auVar53 = vaddps_avx512vl(auVar64,auVar52);
        auVar62 = vmulps_avx512vl(auVar56,auVar61);
        fVar190 = auVar57._0_4_;
        auVar200._0_4_ = fVar190 * auVar63._0_4_;
        fVar202 = auVar57._4_4_;
        auVar200._4_4_ = fVar202 * auVar63._4_4_;
        fVar203 = auVar57._8_4_;
        auVar200._8_4_ = fVar203 * auVar63._8_4_;
        fVar204 = auVar57._12_4_;
        auVar200._12_4_ = fVar204 * auVar63._12_4_;
        auVar212._0_4_ = fVar190 * auVar61._0_4_;
        auVar212._4_4_ = fVar202 * auVar61._4_4_;
        auVar212._8_4_ = fVar203 * auVar61._8_4_;
        auVar212._12_4_ = fVar204 * auVar61._12_4_;
        auVar52 = vmaxps_avx(auVar166,auVar179);
        auVar167._0_4_ = auVar55._0_4_ + auVar52._0_4_;
        auVar167._4_4_ = auVar55._4_4_ + auVar52._4_4_;
        auVar167._8_4_ = auVar55._8_4_ + auVar52._8_4_;
        auVar167._12_4_ = auVar55._12_4_ + auVar52._12_4_;
        auVar180._8_8_ = 0x3f800000;
        auVar180._0_8_ = 0x3f800000;
        auVar55 = vsubps_avx(auVar180,auVar167);
        auVar52 = vsubps_avx(auVar180,auVar53);
        auVar233._0_4_ = fVar205 * auVar55._0_4_;
        auVar233._4_4_ = fVar207 * auVar55._4_4_;
        auVar233._8_4_ = fVar227 * auVar55._8_4_;
        auVar233._12_4_ = fVar228 * auVar55._12_4_;
        auVar225._0_4_ = fVar205 * auVar52._0_4_;
        auVar225._4_4_ = fVar207 * auVar52._4_4_;
        auVar225._8_4_ = fVar227 * auVar52._8_4_;
        auVar225._12_4_ = fVar228 * auVar52._12_4_;
        auVar168._0_4_ = fVar190 * auVar55._0_4_;
        auVar168._4_4_ = fVar202 * auVar55._4_4_;
        auVar168._8_4_ = fVar203 * auVar55._8_4_;
        auVar168._12_4_ = fVar204 * auVar55._12_4_;
        auVar181._0_4_ = fVar190 * auVar52._0_4_;
        auVar181._4_4_ = fVar202 * auVar52._4_4_;
        auVar181._8_4_ = fVar203 * auVar52._8_4_;
        auVar181._12_4_ = fVar204 * auVar52._12_4_;
        auVar55 = vminps_avx(auVar233,auVar225);
        auVar52 = vminps_avx(auVar168,auVar181);
        auVar53 = vminps_avx(auVar55,auVar52);
        auVar55 = vmaxps_avx(auVar225,auVar233);
        auVar52 = vmaxps_avx(auVar181,auVar168);
        auVar52 = vmaxps_avx(auVar52,auVar55);
        auVar63 = vminps_avx512vl(auVar238,auVar62);
        auVar55 = vminps_avx(auVar200,auVar212);
        auVar55 = vminps_avx(auVar63,auVar55);
        auVar55 = vhaddps_avx(auVar53,auVar55);
        auVar62 = vmaxps_avx512vl(auVar62,auVar238);
        auVar53 = vmaxps_avx(auVar212,auVar200);
        auVar53 = vmaxps_avx(auVar53,auVar62);
        auVar52 = vhaddps_avx(auVar52,auVar53);
        auVar55 = vshufps_avx(auVar55,auVar55,0xe8);
        auVar52 = vshufps_avx(auVar52,auVar52,0xe8);
        auVar169._0_4_ = auVar55._0_4_ + auVar58._0_4_;
        auVar169._4_4_ = auVar55._4_4_ + auVar58._4_4_;
        auVar169._8_4_ = auVar55._8_4_ + auVar58._8_4_;
        auVar169._12_4_ = auVar55._12_4_ + auVar58._12_4_;
        auVar182._0_4_ = auVar52._0_4_ + auVar58._0_4_;
        auVar182._4_4_ = auVar52._4_4_ + auVar58._4_4_;
        auVar182._8_4_ = auVar52._8_4_ + auVar58._8_4_;
        auVar182._12_4_ = auVar52._12_4_ + auVar58._12_4_;
        auVar55 = vmaxps_avx(auVar66,auVar169);
        auVar52 = vminps_avx(auVar182,auVar65);
        uVar29 = vcmpps_avx512vl(auVar52,auVar55,1);
        auVar55 = vinsertps_avx(auVar59,auVar60,0x10);
        auVar226 = ZEXT1664(auVar55);
        if ((uVar29 & 3) == 0) {
          vucomiss_avx512f(auVar49);
          auVar52 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
          auVar245 = ZEXT1664(auVar52);
          local_450 = auVar42._0_4_;
          fStack_44c = auVar42._4_4_;
          fStack_448 = auVar42._8_4_;
          fStack_444 = auVar42._12_4_;
          if ((uint)uVar25 < 4 && (uVar4 == 0 || lVar30 == 0)) {
            bVar18 = false;
          }
          else {
            lVar30 = 200;
            do {
              auVar65 = vsubss_avx512f(auVar51,auVar58);
              fVar203 = auVar65._0_4_;
              fVar190 = fVar203 * fVar203 * fVar203;
              fVar204 = auVar58._0_4_;
              fVar202 = fVar204 * 3.0 * fVar203 * fVar203;
              fVar203 = fVar203 * fVar204 * fVar204 * 3.0;
              auVar155._4_4_ = fVar190;
              auVar155._0_4_ = fVar190;
              auVar155._8_4_ = fVar190;
              auVar155._12_4_ = fVar190;
              auVar143._4_4_ = fVar202;
              auVar143._0_4_ = fVar202;
              auVar143._8_4_ = fVar202;
              auVar143._12_4_ = fVar202;
              auVar111._4_4_ = fVar203;
              auVar111._0_4_ = fVar203;
              auVar111._8_4_ = fVar203;
              auVar111._12_4_ = fVar203;
              fVar204 = fVar204 * fVar204 * fVar204;
              auVar159._0_4_ = local_450 * fVar204;
              auVar159._4_4_ = fStack_44c * fVar204;
              auVar159._8_4_ = fStack_448 * fVar204;
              auVar159._12_4_ = fStack_444 * fVar204;
              auVar65 = vfmadd231ps_fma(auVar159,auVar36,auVar111);
              auVar65 = vfmadd231ps_fma(auVar65,auVar40,auVar143);
              auVar65 = vfmadd231ps_fma(auVar65,auVar35,auVar155);
              auVar112._8_8_ = auVar65._0_8_;
              auVar112._0_8_ = auVar65._0_8_;
              auVar65 = vshufpd_avx(auVar65,auVar65,3);
              auVar53 = vshufps_avx(auVar58,auVar58,0x55);
              auVar65 = vsubps_avx(auVar65,auVar112);
              auVar53 = vfmadd213ps_fma(auVar65,auVar53,auVar112);
              fVar190 = auVar53._0_4_;
              auVar65 = vshufps_avx(auVar53,auVar53,0x55);
              auVar113._0_4_ = auVar50._0_4_ * fVar190 + fVar206 * auVar65._0_4_;
              auVar113._4_4_ = auVar50._4_4_ * fVar190 + auVar54._4_4_ * auVar65._4_4_;
              auVar113._8_4_ = auVar50._8_4_ * fVar190 + auVar54._8_4_ * auVar65._8_4_;
              auVar113._12_4_ = auVar50._12_4_ * fVar190 + auVar54._12_4_ * auVar65._12_4_;
              auVar58 = vsubps_avx(auVar58,auVar113);
              auVar65 = vandps_avx512vl(auVar53,auVar242._0_16_);
              auVar53 = vprolq_avx512vl(auVar65,0x20);
              auVar65 = vmaxss_avx(auVar53,auVar65);
              bVar33 = auVar65._0_4_ <= fVar104;
              if (auVar65._0_4_ < fVar104) {
                auVar50 = vucomiss_avx512f(auVar52);
                if (bVar33) {
                  auVar51 = vucomiss_avx512f(auVar50);
                  auVar241 = ZEXT1664(auVar51);
                  auVar226 = ZEXT1664(auVar55);
                  if (bVar33) {
                    vmovshdup_avx(auVar50);
                    auVar51 = vucomiss_avx512f(auVar52);
                    if (bVar33) {
                      auVar54 = vucomiss_avx512f(auVar51);
                      auVar241 = ZEXT1664(auVar54);
                      if (bVar33) {
                        auVar65 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                                0x1c);
                        auVar58 = vinsertps_avx(auVar65,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                      m128[2]),0x28);
                        auVar65 = vdpps_avx(auVar58,local_280,0x7f);
                        auVar53 = vdpps_avx(auVar58,local_290,0x7f);
                        auVar62 = vdpps_avx(auVar58,local_2a0,0x7f);
                        auVar63 = vdpps_avx(auVar58,local_2b0,0x7f);
                        auVar61 = vdpps_avx(auVar58,local_2c0,0x7f);
                        auVar56 = vdpps_avx(auVar58,local_2d0,0x7f);
                        auVar57 = vdpps_avx(auVar58,local_2e0,0x7f);
                        auVar58 = vdpps_avx(auVar58,local_2f0,0x7f);
                        auVar66 = vsubss_avx512f(auVar54,auVar51);
                        fVar206 = auVar51._0_4_;
                        auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * auVar61._0_4_)),auVar66,
                                                  auVar65);
                        auVar65 = vfmadd231ss_fma(ZEXT416((uint)(auVar56._0_4_ * fVar206)),auVar66,
                                                  auVar53);
                        auVar53 = vfmadd231ss_fma(ZEXT416((uint)(auVar57._0_4_ * fVar206)),auVar66,
                                                  auVar62);
                        auVar62 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * auVar58._0_4_)),auVar66,
                                                  auVar63);
                        auVar54 = vsubss_avx512f(auVar54,auVar50);
                        auVar160._0_4_ = auVar54._0_4_;
                        fVar206 = auVar160._0_4_ * auVar160._0_4_ * auVar160._0_4_;
                        local_120 = auVar50._0_4_;
                        fVar190 = local_120 * 3.0 * auVar160._0_4_ * auVar160._0_4_;
                        fVar202 = auVar160._0_4_ * local_120 * local_120 * 3.0;
                        fVar204 = local_120 * local_120 * local_120;
                        auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar204 * auVar62._0_4_)),
                                                  ZEXT416((uint)fVar202),auVar53);
                        auVar54 = vfmadd231ss_fma(auVar54,ZEXT416((uint)fVar190),auVar65);
                        auVar51 = vfmadd231ss_fma(auVar54,ZEXT416((uint)fVar206),auVar51);
                        fVar203 = auVar51._0_4_;
                        if ((fVar100 <= fVar203) &&
                           (fVar205 = *(float *)(ray + k * 4 + 0x100), fVar203 <= fVar205)) {
                          auVar51 = vshufps_avx(auVar50,auVar50,0x55);
                          auVar65 = vsubps_avx512vl(auVar43,auVar51);
                          fVar207 = auVar51._0_4_;
                          auVar187._0_4_ = fVar207 * (float)local_310._0_4_;
                          fVar227 = auVar51._4_4_;
                          auVar187._4_4_ = fVar227 * (float)local_310._4_4_;
                          fVar228 = auVar51._8_4_;
                          auVar187._8_4_ = fVar228 * fStack_308;
                          fVar229 = auVar51._12_4_;
                          auVar187._12_4_ = fVar229 * fStack_304;
                          auVar201._0_4_ = fVar207 * (float)local_360._0_4_;
                          auVar201._4_4_ = fVar227 * (float)local_360._4_4_;
                          auVar201._8_4_ = fVar228 * fStack_358;
                          auVar201._12_4_ = fVar229 * fStack_354;
                          auVar213._0_4_ = fVar207 * (float)local_370._0_4_;
                          auVar213._4_4_ = fVar227 * (float)local_370._4_4_;
                          auVar213._8_4_ = fVar228 * fStack_368;
                          auVar213._12_4_ = fVar229 * fStack_364;
                          auVar170._0_4_ = fVar207 * (float)local_330._0_4_;
                          auVar170._4_4_ = fVar227 * (float)local_330._4_4_;
                          auVar170._8_4_ = fVar228 * fStack_328;
                          auVar170._12_4_ = fVar229 * fStack_324;
                          auVar43 = vfmadd231ps_fma(auVar187,auVar65,local_300);
                          auVar51 = vfmadd231ps_fma(auVar201,auVar65,local_340);
                          auVar54 = vfmadd231ps_fma(auVar213,auVar65,local_350);
                          auVar65 = vfmadd231ps_fma(auVar170,auVar65,local_320);
                          auVar43 = vsubps_avx(auVar51,auVar43);
                          auVar51 = vsubps_avx(auVar54,auVar51);
                          auVar54 = vsubps_avx(auVar65,auVar54);
                          auVar214._0_4_ = local_120 * auVar51._0_4_;
                          auVar214._4_4_ = local_120 * auVar51._4_4_;
                          auVar214._8_4_ = local_120 * auVar51._8_4_;
                          auVar214._12_4_ = local_120 * auVar51._12_4_;
                          auVar160._4_4_ = auVar160._0_4_;
                          auVar160._8_4_ = auVar160._0_4_;
                          auVar160._12_4_ = auVar160._0_4_;
                          auVar43 = vfmadd231ps_fma(auVar214,auVar160,auVar43);
                          auVar171._0_4_ = local_120 * auVar54._0_4_;
                          auVar171._4_4_ = local_120 * auVar54._4_4_;
                          auVar171._8_4_ = local_120 * auVar54._8_4_;
                          auVar171._12_4_ = local_120 * auVar54._12_4_;
                          auVar51 = vfmadd231ps_fma(auVar171,auVar160,auVar51);
                          auVar172._0_4_ = local_120 * auVar51._0_4_;
                          auVar172._4_4_ = local_120 * auVar51._4_4_;
                          auVar172._8_4_ = local_120 * auVar51._8_4_;
                          auVar172._12_4_ = local_120 * auVar51._12_4_;
                          auVar43 = vfmadd231ps_fma(auVar172,auVar160,auVar43);
                          auVar39 = vmulps_avx512vl(auVar43,auVar39);
                          pGVar5 = (context->scene->geometries).items[uVar31].ptr;
                          if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                            bVar33 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar33 = true,
                                  pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar156._0_4_ = fVar204 * (float)local_3c0._0_4_;
                            auVar156._4_4_ = fVar204 * (float)local_3c0._4_4_;
                            auVar156._8_4_ = fVar204 * fStack_3b8;
                            auVar156._12_4_ = fVar204 * fStack_3b4;
                            auVar144._4_4_ = fVar202;
                            auVar144._0_4_ = fVar202;
                            auVar144._8_4_ = fVar202;
                            auVar144._12_4_ = fVar202;
                            auVar43 = vfmadd132ps_fma(auVar144,auVar156,local_3b0);
                            auVar134._4_4_ = fVar190;
                            auVar134._0_4_ = fVar190;
                            auVar134._8_4_ = fVar190;
                            auVar134._12_4_ = fVar190;
                            auVar43 = vfmadd132ps_fma(auVar134,auVar43,local_3a0);
                            auVar127._4_4_ = fVar206;
                            auVar127._0_4_ = fVar206;
                            auVar127._8_4_ = fVar206;
                            auVar127._12_4_ = fVar206;
                            auVar54 = vfmadd132ps_fma(auVar127,auVar43,local_390);
                            auVar43 = vshufps_avx(auVar54,auVar54,0xc9);
                            auVar51 = vshufps_avx(auVar39,auVar39,0xc9);
                            auVar128._0_4_ = auVar54._0_4_ * auVar51._0_4_;
                            auVar128._4_4_ = auVar54._4_4_ * auVar51._4_4_;
                            auVar128._8_4_ = auVar54._8_4_ * auVar51._8_4_;
                            auVar128._12_4_ = auVar54._12_4_ * auVar51._12_4_;
                            auVar39 = vfmsub231ps_fma(auVar128,auVar39,auVar43);
                            auVar146._8_4_ = 1;
                            auVar146._0_8_ = 0x100000001;
                            auVar146._12_4_ = 1;
                            auVar146._16_4_ = 1;
                            auVar146._20_4_ = 1;
                            auVar146._24_4_ = 1;
                            auVar146._28_4_ = 1;
                            local_100 = vpermps_avx2(auVar146,ZEXT1632(auVar50));
                            auVar83 = vpermps_avx2(auVar146,ZEXT1632(auVar39));
                            auVar157._8_4_ = 2;
                            auVar157._0_8_ = 0x200000002;
                            auVar157._12_4_ = 2;
                            auVar157._16_4_ = 2;
                            auVar157._20_4_ = 2;
                            auVar157._24_4_ = 2;
                            auVar157._28_4_ = 2;
                            local_160 = vpermps_avx2(auVar157,ZEXT1632(auVar39));
                            local_140 = auVar39._0_4_;
                            local_180[0] = (RTCHitN)auVar83[0];
                            local_180[1] = (RTCHitN)auVar83[1];
                            local_180[2] = (RTCHitN)auVar83[2];
                            local_180[3] = (RTCHitN)auVar83[3];
                            local_180[4] = (RTCHitN)auVar83[4];
                            local_180[5] = (RTCHitN)auVar83[5];
                            local_180[6] = (RTCHitN)auVar83[6];
                            local_180[7] = (RTCHitN)auVar83[7];
                            local_180[8] = (RTCHitN)auVar83[8];
                            local_180[9] = (RTCHitN)auVar83[9];
                            local_180[10] = (RTCHitN)auVar83[10];
                            local_180[0xb] = (RTCHitN)auVar83[0xb];
                            local_180[0xc] = (RTCHitN)auVar83[0xc];
                            local_180[0xd] = (RTCHitN)auVar83[0xd];
                            local_180[0xe] = (RTCHitN)auVar83[0xe];
                            local_180[0xf] = (RTCHitN)auVar83[0xf];
                            local_180[0x10] = (RTCHitN)auVar83[0x10];
                            local_180[0x11] = (RTCHitN)auVar83[0x11];
                            local_180[0x12] = (RTCHitN)auVar83[0x12];
                            local_180[0x13] = (RTCHitN)auVar83[0x13];
                            local_180[0x14] = (RTCHitN)auVar83[0x14];
                            local_180[0x15] = (RTCHitN)auVar83[0x15];
                            local_180[0x16] = (RTCHitN)auVar83[0x16];
                            local_180[0x17] = (RTCHitN)auVar83[0x17];
                            local_180[0x18] = (RTCHitN)auVar83[0x18];
                            local_180[0x19] = (RTCHitN)auVar83[0x19];
                            local_180[0x1a] = (RTCHitN)auVar83[0x1a];
                            local_180[0x1b] = (RTCHitN)auVar83[0x1b];
                            local_180[0x1c] = (RTCHitN)auVar83[0x1c];
                            local_180[0x1d] = (RTCHitN)auVar83[0x1d];
                            local_180[0x1e] = (RTCHitN)auVar83[0x1e];
                            local_180[0x1f] = (RTCHitN)auVar83[0x1f];
                            uStack_13c = local_140;
                            uStack_138 = local_140;
                            uStack_134 = local_140;
                            uStack_130 = local_140;
                            uStack_12c = local_140;
                            uStack_128 = local_140;
                            uStack_124 = local_140;
                            fStack_11c = local_120;
                            fStack_118 = local_120;
                            fStack_114 = local_120;
                            fStack_110 = local_120;
                            fStack_10c = local_120;
                            fStack_108 = local_120;
                            fStack_104 = local_120;
                            local_e0 = local_200._0_8_;
                            uStack_d8 = local_200._8_8_;
                            uStack_d0 = local_200._16_8_;
                            uStack_c8 = local_200._24_8_;
                            local_c0 = local_220;
                            vpcmpeqd_avx2(local_220,local_220);
                            uStack_9c = context->user->instID[0];
                            local_a0 = uStack_9c;
                            uStack_98 = uStack_9c;
                            uStack_94 = uStack_9c;
                            uStack_90 = uStack_9c;
                            uStack_8c = uStack_9c;
                            uStack_88 = uStack_9c;
                            uStack_84 = uStack_9c;
                            uStack_7c = context->user->instPrimID[0];
                            local_80 = uStack_7c;
                            uStack_78 = uStack_7c;
                            uStack_74 = uStack_7c;
                            uStack_70 = uStack_7c;
                            uStack_6c = uStack_7c;
                            uStack_68 = uStack_7c;
                            uStack_64 = uStack_7c;
                            *(float *)(ray + k * 4 + 0x100) = fVar203;
                            local_3e0 = local_240._0_8_;
                            uStack_3d8 = local_240._8_8_;
                            uStack_3d0 = local_240._16_8_;
                            uStack_3c8 = local_240._24_8_;
                            local_410.valid = (int *)&local_3e0;
                            local_410.geometryUserPtr = pGVar5->userPtr;
                            local_410.context = context->user;
                            local_410.ray = (RTCRayN *)ray;
                            local_410.hit = local_180;
                            local_410.N = 8;
                            if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar5->occlusionFilterN)(&local_410);
                              auVar39 = vxorps_avx512vl(auVar52,auVar52);
                              auVar245 = ZEXT1664(auVar39);
                              auVar241 = ZEXT464(0x3f800000);
                              auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              in_ZMM19 = ZEXT3264(auVar83);
                              auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar240 = ZEXT1664(auVar39);
                              auVar39 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar239 = ZEXT1664(auVar39);
                              auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar243 = ZEXT1664(auVar39);
                              auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar242 = ZEXT1664(auVar39);
                            }
                            auVar39 = auVar245._0_16_;
                            auVar21._8_8_ = uStack_3d8;
                            auVar21._0_8_ = local_3e0;
                            auVar21._16_8_ = uStack_3d0;
                            auVar21._24_8_ = uStack_3c8;
                            if (auVar21 == (undefined1  [32])0x0) {
                              bVar33 = false;
                            }
                            else {
                              p_Var8 = context->args->filter;
                              if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var8)(&local_410);
                                auVar39 = vxorps_avx512vl(auVar39,auVar39);
                                auVar245 = ZEXT1664(auVar39);
                                auVar241 = ZEXT464(0x3f800000);
                                auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                in_ZMM19 = ZEXT3264(auVar83);
                                auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar240 = ZEXT1664(auVar39);
                                auVar39 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar239 = ZEXT1664(auVar39);
                                auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar243 = ZEXT1664(auVar39);
                                auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar242 = ZEXT1664(auVar39);
                              }
                              auVar22._8_8_ = uStack_3d8;
                              auVar22._0_8_ = local_3e0;
                              auVar22._16_8_ = uStack_3d0;
                              auVar22._24_8_ = uStack_3c8;
                              uVar29 = vptestmd_avx512vl(auVar22,auVar22);
                              auVar83 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                              bVar33 = (bool)((byte)uVar29 & 1);
                              bVar9 = (bool)((byte)(uVar29 >> 1) & 1);
                              bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
                              bVar11 = (bool)((byte)(uVar29 >> 3) & 1);
                              bVar12 = (bool)((byte)(uVar29 >> 4) & 1);
                              bVar13 = (bool)((byte)(uVar29 >> 5) & 1);
                              bVar14 = (bool)((byte)(uVar29 >> 6) & 1);
                              bVar15 = SUB81(uVar29 >> 7,0);
                              *(uint *)(local_410.ray + 0x100) =
                                   (uint)bVar33 * auVar83._0_4_ |
                                   (uint)!bVar33 * *(int *)(local_410.ray + 0x100);
                              *(uint *)(local_410.ray + 0x104) =
                                   (uint)bVar9 * auVar83._4_4_ |
                                   (uint)!bVar9 * *(int *)(local_410.ray + 0x104);
                              *(uint *)(local_410.ray + 0x108) =
                                   (uint)bVar10 * auVar83._8_4_ |
                                   (uint)!bVar10 * *(int *)(local_410.ray + 0x108);
                              *(uint *)(local_410.ray + 0x10c) =
                                   (uint)bVar11 * auVar83._12_4_ |
                                   (uint)!bVar11 * *(int *)(local_410.ray + 0x10c);
                              *(uint *)(local_410.ray + 0x110) =
                                   (uint)bVar12 * auVar83._16_4_ |
                                   (uint)!bVar12 * *(int *)(local_410.ray + 0x110);
                              *(uint *)(local_410.ray + 0x114) =
                                   (uint)bVar13 * auVar83._20_4_ |
                                   (uint)!bVar13 * *(int *)(local_410.ray + 0x114);
                              *(uint *)(local_410.ray + 0x118) =
                                   (uint)bVar14 * auVar83._24_4_ |
                                   (uint)!bVar14 * *(int *)(local_410.ray + 0x118);
                              *(uint *)(local_410.ray + 0x11c) =
                                   (uint)bVar15 * auVar83._28_4_ |
                                   (uint)!bVar15 * *(int *)(local_410.ray + 0x11c);
                              bVar33 = auVar22 != (undefined1  [32])0x0;
                            }
                            if (!bVar33) {
                              *(float *)(ray + k * 4 + 0x100) = fVar205;
                            }
                          }
                          auVar226 = ZEXT1664(auVar55);
                          bVar32 = (bool)(bVar32 | bVar33);
                        }
                      }
                    }
                  }
                  goto LAB_01b42d0d;
                }
                break;
              }
              lVar30 = lVar30 + -1;
            } while (lVar30 != 0);
          }
          auVar226 = ZEXT1664(auVar55);
        }
        else {
          auVar39 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
          auVar245 = ZEXT1664(auVar39);
        }
      }
LAB_01b42d0d:
    } while (bVar18);
    auVar39 = vinsertps_avx512f(auVar49,auVar44,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }